

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  long lVar78;
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [28];
  int iVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  long lVar98;
  ulong uVar99;
  undefined4 uVar100;
  undefined8 uVar101;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar102 [16];
  float fVar120;
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  float fVar123;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar124;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai_2;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar164 [64];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar190;
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined4 uVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined4 uVar209;
  float fVar210;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8a0 [32];
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 (*local_768) [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [2] [32];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  int local_3a0;
  int local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  
  PVar8 = prim[1];
  uVar99 = (ulong)(byte)PVar8;
  lVar78 = uVar99 * 0x19;
  fVar210 = *(float *)(prim + lVar78 + 0x12);
  auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar170 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar170 = vsubps_avx(auVar170,*(undefined1 (*) [16])(prim + lVar78 + 6));
  auVar102._0_4_ = fVar210 * auVar170._0_4_;
  auVar102._4_4_ = fVar210 * auVar170._4_4_;
  auVar102._8_4_ = fVar210 * auVar170._8_4_;
  auVar102._12_4_ = fVar210 * auVar170._12_4_;
  auVar183._0_4_ = fVar210 * auVar12._0_4_;
  auVar183._4_4_ = fVar210 * auVar12._4_4_;
  auVar183._8_4_ = fVar210 * auVar12._8_4_;
  auVar183._12_4_ = fVar210 * auVar12._12_4_;
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar99 + 6)));
  auVar175 = vcvtdq2ps_avx(auVar175);
  uVar95 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + uVar99 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar95 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar227._4_4_ = auVar183._0_4_;
  auVar227._0_4_ = auVar183._0_4_;
  auVar227._8_4_ = auVar183._0_4_;
  auVar227._12_4_ = auVar183._0_4_;
  auVar126 = vshufps_avx(auVar183,auVar183,0x55);
  auVar103 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar210 = auVar103._0_4_;
  auVar211._0_4_ = fVar210 * auVar14._0_4_;
  fVar120 = auVar103._4_4_;
  auVar211._4_4_ = fVar120 * auVar14._4_4_;
  fVar121 = auVar103._8_4_;
  auVar211._8_4_ = fVar121 * auVar14._8_4_;
  fVar122 = auVar103._12_4_;
  auVar211._12_4_ = fVar122 * auVar14._12_4_;
  auVar207._0_4_ = auVar175._0_4_ * fVar210;
  auVar207._4_4_ = auVar175._4_4_ * fVar120;
  auVar207._8_4_ = auVar175._8_4_ * fVar121;
  auVar207._12_4_ = auVar175._12_4_ * fVar122;
  auVar197._0_4_ = auVar143._0_4_ * fVar210;
  auVar197._4_4_ = auVar143._4_4_ * fVar120;
  auVar197._8_4_ = auVar143._8_4_ * fVar121;
  auVar197._12_4_ = auVar143._12_4_ * fVar122;
  auVar103 = vfmadd231ps_fma(auVar211,auVar126,auVar12);
  auVar127 = vfmadd231ps_fma(auVar207,auVar126,auVar16);
  auVar126 = vfmadd231ps_fma(auVar197,auVar104,auVar126);
  auVar160 = vfmadd231ps_fma(auVar103,auVar227,auVar170);
  auVar127 = vfmadd231ps_fma(auVar127,auVar227,auVar15);
  auVar166 = vfmadd231ps_fma(auVar126,auVar105,auVar227);
  auVar228._4_4_ = auVar102._0_4_;
  auVar228._0_4_ = auVar102._0_4_;
  auVar228._8_4_ = auVar102._0_4_;
  auVar228._12_4_ = auVar102._0_4_;
  auVar126 = vshufps_avx(auVar102,auVar102,0x55);
  auVar103 = vshufps_avx(auVar102,auVar102,0xaa);
  fVar210 = auVar103._0_4_;
  auVar184._0_4_ = fVar210 * auVar14._0_4_;
  fVar120 = auVar103._4_4_;
  auVar184._4_4_ = fVar120 * auVar14._4_4_;
  fVar121 = auVar103._8_4_;
  auVar184._8_4_ = fVar121 * auVar14._8_4_;
  fVar122 = auVar103._12_4_;
  auVar184._12_4_ = fVar122 * auVar14._12_4_;
  auVar125._0_4_ = auVar175._0_4_ * fVar210;
  auVar125._4_4_ = auVar175._4_4_ * fVar120;
  auVar125._8_4_ = auVar175._8_4_ * fVar121;
  auVar125._12_4_ = auVar175._12_4_ * fVar122;
  auVar103._0_4_ = auVar143._0_4_ * fVar210;
  auVar103._4_4_ = auVar143._4_4_ * fVar120;
  auVar103._8_4_ = auVar143._8_4_ * fVar121;
  auVar103._12_4_ = auVar143._12_4_ * fVar122;
  auVar12 = vfmadd231ps_fma(auVar184,auVar126,auVar12);
  auVar14 = vfmadd231ps_fma(auVar125,auVar126,auVar16);
  auVar16 = vfmadd231ps_fma(auVar103,auVar126,auVar104);
  auVar175 = vfmadd231ps_fma(auVar12,auVar228,auVar170);
  auVar104 = vfmadd231ps_fma(auVar14,auVar228,auVar15);
  auVar143 = vfmadd231ps_fma(auVar16,auVar228,auVar105);
  local_410._8_4_ = 0x7fffffff;
  local_410._0_8_ = 0x7fffffff7fffffff;
  local_410._12_4_ = 0x7fffffff;
  auVar170 = vandps_avx(auVar160,local_410);
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  auVar170 = vcmpps_avx(auVar170,auVar165,1);
  auVar12 = vblendvps_avx(auVar160,auVar165,auVar170);
  auVar170 = vandps_avx(auVar127,local_410);
  auVar170 = vcmpps_avx(auVar170,auVar165,1);
  auVar14 = vblendvps_avx(auVar127,auVar165,auVar170);
  auVar170 = vandps_avx(auVar166,local_410);
  auVar170 = vcmpps_avx(auVar170,auVar165,1);
  auVar170 = vblendvps_avx(auVar166,auVar165,auVar170);
  auVar15 = vrcpps_avx(auVar12);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = 0x3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar15,auVar194);
  auVar15 = vfmadd132ps_fma(auVar12,auVar15,auVar15);
  auVar12 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar12,auVar194);
  auVar16 = vfmadd132ps_fma(auVar14,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar170);
  auVar170 = vfnmadd213ps_fma(auVar170,auVar12,auVar194);
  auVar105 = vfmadd132ps_fma(auVar170,auVar12,auVar12);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar170 = vpmovsxwd_avx(auVar170);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar170 = vsubps_avx(auVar170,auVar175);
  auVar166._0_4_ = auVar15._0_4_ * auVar170._0_4_;
  auVar166._4_4_ = auVar15._4_4_ * auVar170._4_4_;
  auVar166._8_4_ = auVar15._8_4_ * auVar170._8_4_;
  auVar166._12_4_ = auVar15._12_4_ * auVar170._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar170 = vpmovsxwd_avx(auVar12);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar170 = vsubps_avx(auVar170,auVar175);
  auVar185._0_4_ = auVar15._0_4_ * auVar170._0_4_;
  auVar185._4_4_ = auVar15._4_4_ * auVar170._4_4_;
  auVar185._8_4_ = auVar15._8_4_ * auVar170._8_4_;
  auVar185._12_4_ = auVar15._12_4_ * auVar170._12_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar99 * -2 + 6);
  auVar170 = vpmovsxwd_avx(auVar15);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar170 = vsubps_avx(auVar170,auVar104);
  auVar198._0_4_ = auVar170._0_4_ * auVar16._0_4_;
  auVar198._4_4_ = auVar170._4_4_ * auVar16._4_4_;
  auVar198._8_4_ = auVar170._8_4_ * auVar16._8_4_;
  auVar198._12_4_ = auVar170._12_4_ * auVar16._12_4_;
  auVar170 = vcvtdq2ps_avx(auVar12);
  auVar170 = vsubps_avx(auVar170,auVar104);
  auVar126._0_4_ = auVar16._0_4_ * auVar170._0_4_;
  auVar126._4_4_ = auVar16._4_4_ * auVar170._4_4_;
  auVar126._8_4_ = auVar16._8_4_ * auVar170._8_4_;
  auVar126._12_4_ = auVar16._12_4_ * auVar170._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar95 + uVar99 + 6);
  auVar170 = vpmovsxwd_avx(auVar16);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar170 = vsubps_avx(auVar170,auVar143);
  auVar160._0_4_ = auVar105._0_4_ * auVar170._0_4_;
  auVar160._4_4_ = auVar105._4_4_ * auVar170._4_4_;
  auVar160._8_4_ = auVar105._8_4_ * auVar170._8_4_;
  auVar160._12_4_ = auVar105._12_4_ * auVar170._12_4_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar170 = vpmovsxwd_avx(auVar175);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar170 = vsubps_avx(auVar170,auVar143);
  auVar104._0_4_ = auVar105._0_4_ * auVar170._0_4_;
  auVar104._4_4_ = auVar105._4_4_ * auVar170._4_4_;
  auVar104._8_4_ = auVar105._8_4_ * auVar170._8_4_;
  auVar104._12_4_ = auVar105._12_4_ * auVar170._12_4_;
  auVar170 = vpminsd_avx(auVar166,auVar185);
  auVar12 = vpminsd_avx(auVar198,auVar126);
  auVar170 = vmaxps_avx(auVar170,auVar12);
  auVar12 = vpminsd_avx(auVar160,auVar104);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar202._4_4_ = uVar4;
  auVar202._0_4_ = uVar4;
  auVar202._8_4_ = uVar4;
  auVar202._12_4_ = uVar4;
  auVar12 = vmaxps_avx(auVar12,auVar202);
  auVar170 = vmaxps_avx(auVar170,auVar12);
  local_420._0_4_ = auVar170._0_4_ * 0.99999964;
  local_420._4_4_ = auVar170._4_4_ * 0.99999964;
  local_420._8_4_ = auVar170._8_4_ * 0.99999964;
  local_420._12_4_ = auVar170._12_4_ * 0.99999964;
  auVar170 = vpmaxsd_avx(auVar166,auVar185);
  auVar12 = vpmaxsd_avx(auVar198,auVar126);
  auVar170 = vminps_avx(auVar170,auVar12);
  auVar12 = vpmaxsd_avx(auVar160,auVar104);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar143._4_4_ = uVar4;
  auVar143._0_4_ = uVar4;
  auVar143._8_4_ = uVar4;
  auVar143._12_4_ = uVar4;
  auVar12 = vminps_avx(auVar12,auVar143);
  auVar170 = vminps_avx(auVar170,auVar12);
  auVar105._0_4_ = auVar170._0_4_ * 1.0000004;
  auVar105._4_4_ = auVar170._4_4_ * 1.0000004;
  auVar105._8_4_ = auVar170._8_4_ * 1.0000004;
  auVar105._12_4_ = auVar170._12_4_ * 1.0000004;
  auVar127[4] = PVar8;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar8;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar8;
  auVar127._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar127,_DAT_01f7fcf0);
  auVar170 = vcmpps_avx(local_420,auVar105,2);
  auVar170 = vandps_avx(auVar170,auVar12);
  uVar96 = vmovmskps_avx(auVar170);
  if (uVar96 != 0) {
    uVar96 = uVar96 & 0xff;
    local_680[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_680[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_768 = (undefined1 (*) [32])&local_180;
    iVar93 = 1 << ((uint)k & 0x1f);
    auVar109._4_4_ = iVar93;
    auVar109._0_4_ = iVar93;
    auVar109._8_4_ = iVar93;
    auVar109._12_4_ = iVar93;
    auVar109._16_4_ = iVar93;
    auVar109._20_4_ = iVar93;
    auVar109._24_4_ = iVar93;
    auVar109._28_4_ = iVar93;
    auVar117 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar109 = vpand_avx2(auVar109,auVar117);
    local_2c0 = vpcmpeqd_avx2(auVar109,auVar117);
    do {
      lVar23 = 0;
      uVar99 = (ulong)uVar96;
      for (uVar95 = uVar99; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar99 = uVar99 - 1 & uVar99;
      uVar4 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar95 = (ulong)(uint)((int)lVar23 << 6);
      local_8a0._4_4_ = *(undefined4 *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
      pPVar1 = prim + uVar95 + lVar78 + 0x16;
      uVar89 = *(undefined8 *)pPVar1;
      uVar90 = *(undefined8 *)(pPVar1 + 8);
      auVar14 = *(undefined1 (*) [16])pPVar1;
      auVar12 = *(undefined1 (*) [16])pPVar1;
      auVar170 = *(undefined1 (*) [16])pPVar1;
      if (uVar99 != 0) {
        uVar97 = uVar99 - 1 & uVar99;
        for (uVar24 = uVar99; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar15 = *(undefined1 (*) [16])(prim + uVar95 + lVar78 + 0x26);
      auVar16 = *(undefined1 (*) [16])(prim + uVar95 + lVar78 + 0x36);
      auVar175 = *(undefined1 (*) [16])(prim + uVar95 + lVar78 + 0x46);
      iVar93 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar126 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar104 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar126);
      uVar100 = auVar104._0_4_;
      auVar167._4_4_ = uVar100;
      auVar167._0_4_ = uVar100;
      auVar167._8_4_ = uVar100;
      auVar167._12_4_ = uVar100;
      auVar105 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar210 = pre->ray_space[k].vz.field_0.m128[0];
      fVar120 = pre->ray_space[k].vz.field_0.m128[1];
      fVar121 = pre->ray_space[k].vz.field_0.m128[2];
      fVar122 = pre->ray_space[k].vz.field_0.m128[3];
      auVar191._0_4_ = fVar210 * auVar104._0_4_;
      auVar191._4_4_ = fVar120 * auVar104._4_4_;
      auVar191._8_4_ = fVar121 * auVar104._8_4_;
      auVar191._12_4_ = fVar122 * auVar104._12_4_;
      auVar105 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar6,auVar105);
      auVar127 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar167);
      auVar105 = vblendps_avx(auVar127,*(undefined1 (*) [16])pPVar1,8);
      auVar143 = vsubps_avx(auVar15,auVar126);
      uVar100 = auVar143._0_4_;
      auVar192._4_4_ = uVar100;
      auVar192._0_4_ = uVar100;
      auVar192._8_4_ = uVar100;
      auVar192._12_4_ = uVar100;
      auVar104 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar203._0_4_ = fVar210 * auVar143._0_4_;
      auVar203._4_4_ = fVar120 * auVar143._4_4_;
      auVar203._8_4_ = fVar121 * auVar143._8_4_;
      auVar203._12_4_ = fVar122 * auVar143._12_4_;
      auVar104 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar104);
      auVar160 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar5,auVar192);
      auVar104 = vblendps_avx(auVar160,auVar15,8);
      auVar103 = vsubps_avx(auVar16,auVar126);
      uVar100 = auVar103._0_4_;
      auVar195._4_4_ = uVar100;
      auVar195._0_4_ = uVar100;
      auVar195._8_4_ = uVar100;
      auVar195._12_4_ = uVar100;
      auVar143 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar212._0_4_ = fVar210 * auVar103._0_4_;
      auVar212._4_4_ = fVar120 * auVar103._4_4_;
      auVar212._8_4_ = fVar121 * auVar103._8_4_;
      auVar212._12_4_ = fVar122 * auVar103._12_4_;
      auVar143 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar6,auVar143);
      auVar166 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar5,auVar195);
      auVar143 = vblendps_avx(auVar166,auVar16,8);
      auVar103 = vsubps_avx(auVar175,auVar126);
      uVar100 = auVar103._0_4_;
      auVar196._4_4_ = uVar100;
      auVar196._0_4_ = uVar100;
      auVar196._8_4_ = uVar100;
      auVar196._12_4_ = uVar100;
      auVar126 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar222._0_4_ = fVar210 * auVar103._0_4_;
      auVar222._4_4_ = fVar120 * auVar103._4_4_;
      auVar222._8_4_ = fVar121 * auVar103._8_4_;
      auVar222._12_4_ = fVar122 * auVar103._12_4_;
      auVar126 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar6,auVar126);
      auVar102 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar5,auVar196);
      auVar126 = vblendps_avx(auVar102,auVar175,8);
      auVar105 = vandps_avx(auVar105,local_410);
      auVar104 = vandps_avx(auVar104,local_410);
      auVar103 = vmaxps_avx(auVar105,auVar104);
      auVar105 = vandps_avx(auVar143,local_410);
      auVar104 = vandps_avx(auVar126,local_410);
      auVar105 = vmaxps_avx(auVar105,auVar104);
      auVar105 = vmaxps_avx(auVar103,auVar105);
      auVar104 = vmovshdup_avx(auVar105);
      auVar104 = vmaxss_avx(auVar104,auVar105);
      auVar105 = vshufpd_avx(auVar105,auVar105,1);
      auVar105 = vmaxss_avx(auVar105,auVar104);
      lVar23 = (long)iVar93 * 0x44;
      auVar104 = vmovshdup_avx(auVar127);
      uVar101 = auVar104._0_8_;
      local_540._8_8_ = uVar101;
      local_540._0_8_ = uVar101;
      local_540._16_8_ = uVar101;
      local_540._24_8_ = uVar101;
      auVar104 = vmovshdup_avx(auVar160);
      uVar101 = auVar104._0_8_;
      local_560._8_8_ = uVar101;
      local_560._0_8_ = uVar101;
      local_560._16_8_ = uVar101;
      local_560._24_8_ = uVar101;
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      uVar209 = auVar166._0_4_;
      local_720._4_4_ = uVar209;
      local_720._0_4_ = uVar209;
      local_720._8_4_ = uVar209;
      local_720._12_4_ = uVar209;
      local_720._16_4_ = uVar209;
      local_720._20_4_ = uVar209;
      local_720._24_4_ = uVar209;
      local_720._28_4_ = uVar209;
      auVar104 = vmovshdup_avx(auVar166);
      uVar101 = auVar104._0_8_;
      local_6c0._8_8_ = uVar101;
      local_6c0._0_8_ = uVar101;
      local_6c0._16_8_ = uVar101;
      local_6c0._24_8_ = uVar101;
      fVar210 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      auVar92 = *(undefined1 (*) [28])(bspline_basis0 + lVar23 + 0xd8c);
      local_520 = auVar102._0_4_;
      auVar104 = vmovshdup_avx(auVar102);
      local_280 = auVar104._0_8_;
      auVar117._4_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xd90);
      auVar117._0_4_ = local_520 * fVar210;
      auVar117._8_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xd94);
      auVar117._12_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xd98);
      auVar117._16_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xd9c);
      auVar117._20_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xda0);
      auVar117._24_4_ = local_520 * *(float *)(bspline_basis0 + lVar23 + 0xda4);
      auVar117._28_4_ = *(undefined4 *)(bspline_basis0 + lVar23 + 0xda8);
      auVar143 = vfmadd231ps_fma(auVar117,auVar109,local_720);
      fVar182 = auVar104._0_4_;
      auVar116._0_4_ = fVar182 * fVar210;
      fVar190 = auVar104._4_4_;
      auVar116._4_4_ = fVar190 * *(float *)(bspline_basis0 + lVar23 + 0xd90);
      auVar116._8_4_ = fVar182 * *(float *)(bspline_basis0 + lVar23 + 0xd94);
      auVar116._12_4_ = fVar190 * *(float *)(bspline_basis0 + lVar23 + 0xd98);
      auVar116._16_4_ = fVar182 * *(float *)(bspline_basis0 + lVar23 + 0xd9c);
      auVar116._20_4_ = fVar190 * *(float *)(bspline_basis0 + lVar23 + 0xda0);
      auVar116._24_4_ = fVar182 * *(float *)(bspline_basis0 + lVar23 + 0xda4);
      auVar116._28_4_ = 0;
      auVar104 = vfmadd231ps_fma(auVar116,auVar109,local_6c0);
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      uVar201 = auVar160._0_4_;
      auVar178._4_4_ = uVar201;
      auVar178._0_4_ = uVar201;
      auVar178._8_4_ = uVar201;
      auVar178._12_4_ = uVar201;
      auVar178._16_4_ = uVar201;
      auVar178._20_4_ = uVar201;
      auVar178._24_4_ = uVar201;
      auVar178._28_4_ = uVar201;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,auVar178);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar117,local_560);
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar100 = auVar127._0_4_;
      auVar229._4_4_ = uVar100;
      auVar229._0_4_ = uVar100;
      auVar229._8_4_ = uVar100;
      auVar229._12_4_ = uVar100;
      auVar229._16_4_ = uVar100;
      auVar229._20_4_ = uVar100;
      auVar229._24_4_ = uVar100;
      auVar229._28_4_ = uVar100;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,auVar229);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar116,local_540);
      auVar132 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      fVar218 = *(float *)(bspline_basis1 + lVar23 + 0xd8c);
      fVar219 = *(float *)(bspline_basis1 + lVar23 + 0xd90);
      fVar220 = *(float *)(bspline_basis1 + lVar23 + 0xd94);
      fVar221 = *(float *)(bspline_basis1 + lVar23 + 0xd98);
      fVar123 = *(float *)(bspline_basis1 + lVar23 + 0xd9c);
      fVar80 = *(float *)(bspline_basis1 + lVar23 + 0xda0);
      fVar81 = *(float *)(bspline_basis1 + lVar23 + 0xda4);
      auVar223._4_4_ = local_520 * fVar219;
      auVar223._0_4_ = local_520 * fVar218;
      auVar223._8_4_ = local_520 * fVar220;
      auVar223._12_4_ = local_520 * fVar221;
      auVar223._16_4_ = local_520 * fVar123;
      auVar223._20_4_ = local_520 * fVar80;
      auVar223._24_4_ = local_520 * fVar81;
      auVar223._28_4_ = *(undefined4 *)(bspline_basis0 + lVar23 + 0xda8);
      auVar126 = vfmadd231ps_fma(auVar223,auVar132,local_720);
      uStack_278 = local_280;
      uStack_270 = local_280;
      uStack_268 = local_280;
      auVar7._4_4_ = fVar219 * fVar190;
      auVar7._0_4_ = fVar218 * fVar182;
      auVar7._8_4_ = fVar220 * fVar182;
      auVar7._12_4_ = fVar221 * fVar190;
      auVar7._16_4_ = fVar123 * fVar182;
      auVar7._20_4_ = fVar80 * fVar190;
      auVar7._24_4_ = fVar81 * fVar182;
      auVar7._28_4_ = uVar209;
      auVar103 = vfmadd231ps_fma(auVar7,auVar132,local_6c0);
      auVar223 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar223,auVar178);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar223,local_560);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,auVar229);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar7,local_540);
      local_460 = ZEXT1632(auVar126);
      local_440 = ZEXT1632(auVar143);
      local_580 = vsubps_avx(local_460,local_440);
      _local_5c0 = ZEXT1632(auVar103);
      local_480 = ZEXT1632(auVar104);
      local_4a0 = vsubps_avx(_local_5c0,local_480);
      auVar110._0_4_ = auVar104._0_4_ * local_580._0_4_;
      auVar110._4_4_ = auVar104._4_4_ * local_580._4_4_;
      auVar110._8_4_ = auVar104._8_4_ * local_580._8_4_;
      auVar110._12_4_ = auVar104._12_4_ * local_580._12_4_;
      auVar110._16_4_ = local_580._16_4_ * 0.0;
      auVar110._20_4_ = local_580._20_4_ * 0.0;
      auVar110._24_4_ = local_580._24_4_ * 0.0;
      auVar110._28_4_ = 0;
      fVar210 = local_4a0._0_4_;
      auVar128._0_4_ = auVar143._0_4_ * fVar210;
      fVar120 = local_4a0._4_4_;
      auVar128._4_4_ = auVar143._4_4_ * fVar120;
      fVar121 = local_4a0._8_4_;
      auVar128._8_4_ = auVar143._8_4_ * fVar121;
      fVar122 = local_4a0._12_4_;
      auVar128._12_4_ = auVar143._12_4_ * fVar122;
      fVar13 = local_4a0._16_4_;
      auVar128._16_4_ = fVar13 * 0.0;
      fVar216 = local_4a0._20_4_;
      auVar128._20_4_ = fVar216 * 0.0;
      fVar217 = local_4a0._24_4_;
      auVar128._24_4_ = fVar217 * 0.0;
      auVar128._28_4_ = 0;
      auVar110 = vsubps_avx(auVar110,auVar128);
      auVar104 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar101 = auVar104._0_8_;
      local_80._8_8_ = uVar101;
      local_80._0_8_ = uVar101;
      local_80._16_8_ = uVar101;
      local_80._24_8_ = uVar101;
      auVar143 = vpermilps_avx(auVar15,0xff);
      uVar101 = auVar143._0_8_;
      local_a0._8_8_ = uVar101;
      local_a0._0_8_ = uVar101;
      local_a0._16_8_ = uVar101;
      local_a0._24_8_ = uVar101;
      auVar143 = vpermilps_avx(auVar16,0xff);
      uVar101 = auVar143._0_8_;
      local_c0._8_8_ = uVar101;
      local_c0._0_8_ = uVar101;
      local_c0._16_8_ = uVar101;
      local_c0._24_8_ = uVar101;
      auVar143 = vpermilps_avx(auVar175,0xff);
      local_e0 = auVar143._0_8_;
      local_900 = auVar92._0_4_;
      fStack_8fc = auVar92._4_4_;
      fStack_8f8 = auVar92._8_4_;
      fStack_8f4 = auVar92._12_4_;
      fStack_8f0 = auVar92._16_4_;
      fStack_8ec = auVar92._20_4_;
      fStack_8e8 = auVar92._24_4_;
      fVar124 = auVar143._0_4_;
      fVar142 = auVar143._4_4_;
      auVar199._4_4_ = fVar142 * fStack_8fc;
      auVar199._0_4_ = fVar124 * local_900;
      auVar199._8_4_ = fVar124 * fStack_8f8;
      auVar199._12_4_ = fVar142 * fStack_8f4;
      auVar199._16_4_ = fVar124 * fStack_8f0;
      auVar199._20_4_ = fVar142 * fStack_8ec;
      auVar199._24_4_ = fVar124 * fStack_8e8;
      auVar199._28_4_ = uVar201;
      auVar143 = vfmadd231ps_fma(auVar199,local_c0,auVar109);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,local_a0);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar21._4_4_ = fVar219 * fVar142;
      auVar21._0_4_ = fVar218 * fVar124;
      auVar21._8_4_ = fVar220 * fVar124;
      auVar21._12_4_ = fVar221 * fVar142;
      auVar21._16_4_ = fVar123 * fVar124;
      auVar21._20_4_ = fVar80 * fVar142;
      auVar21._24_4_ = fVar81 * fVar124;
      auVar21._28_4_ = fVar142;
      auVar126 = vfmadd231ps_fma(auVar21,auVar132,local_c0);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar223,local_a0);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,local_80);
      auVar156._4_4_ = fVar120 * fVar120;
      auVar156._0_4_ = fVar210 * fVar210;
      auVar156._8_4_ = fVar121 * fVar121;
      auVar156._12_4_ = fVar122 * fVar122;
      auVar156._16_4_ = fVar13 * fVar13;
      auVar156._20_4_ = fVar216 * fVar216;
      auVar156._24_4_ = fVar217 * fVar217;
      auVar156._28_4_ = auVar104._4_4_;
      auVar104 = vfmadd231ps_fma(auVar156,local_580,local_580);
      auVar156 = ZEXT1632(auVar126);
      auVar199 = vmaxps_avx(ZEXT1632(auVar143),auVar156);
      auVar22._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar104._4_4_;
      auVar22._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar104._0_4_;
      auVar22._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar104._8_4_;
      auVar22._12_4_ = auVar199._12_4_ * auVar199._12_4_ * auVar104._12_4_;
      auVar22._16_4_ = auVar199._16_4_ * auVar199._16_4_ * 0.0;
      auVar22._20_4_ = auVar199._20_4_ * auVar199._20_4_ * 0.0;
      auVar22._24_4_ = auVar199._24_4_ * auVar199._24_4_ * 0.0;
      auVar22._28_4_ = auVar199._28_4_;
      auVar20._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar20._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar20._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar20._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar20._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar20._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar20._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar20._28_4_ = 0;
      auVar199 = vcmpps_avx(auVar20,auVar22,2);
      fVar210 = auVar105._0_4_ * 4.7683716e-07;
      auVar111._0_4_ = (float)iVar93;
      uStack_59c = auVar102._4_4_;
      uStack_598 = auVar102._8_4_;
      uStack_594 = auVar102._12_4_;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar111._16_4_ = auVar111._0_4_;
      auVar111._20_4_ = auVar111._0_4_;
      auVar111._24_4_ = auVar111._0_4_;
      auVar111._28_4_ = auVar111._0_4_;
      auVar110 = vcmpps_avx(_DAT_01faff40,auVar111,1);
      auVar105 = vpermilps_avx(auVar127,0xaa);
      uVar101 = auVar105._0_8_;
      auVar161._8_8_ = uVar101;
      auVar161._0_8_ = uVar101;
      auVar161._16_8_ = uVar101;
      auVar161._24_8_ = uVar101;
      auVar105 = vpermilps_avx(auVar160,0xaa);
      uVar101 = auVar105._0_8_;
      local_740._8_8_ = uVar101;
      local_740._0_8_ = uVar101;
      local_740._16_8_ = uVar101;
      local_740._24_8_ = uVar101;
      auVar104 = vpermilps_avx(auVar166,0xaa);
      uVar101 = auVar104._0_8_;
      auVar208._8_8_ = uVar101;
      auVar208._0_8_ = uVar101;
      auVar208._16_8_ = uVar101;
      auVar208._24_8_ = uVar101;
      auVar105 = vshufps_avx(auVar102,auVar102,0xaa);
      uVar101 = auVar105._0_8_;
      register0x00001508 = uVar101;
      local_700 = uVar101;
      register0x00001510 = uVar101;
      register0x00001518 = uVar101;
      auVar225 = ZEXT3264(_local_700);
      auVar21 = auVar110 & auVar199;
      uVar96 = *(uint *)(ray + k * 4 + 0x60);
      local_620._0_16_ = ZEXT416(uVar96);
      local_850 = auVar15._0_8_;
      uStack_848 = auVar15._8_8_;
      local_860 = auVar16._0_8_;
      uStack_858 = auVar16._8_8_;
      local_870._0_4_ = auVar175._0_4_;
      fVar120 = (float)local_870;
      local_870._4_4_ = auVar175._4_4_;
      fVar121 = local_870._4_4_;
      uStack_868._0_4_ = auVar175._8_4_;
      fVar122 = (float)uStack_868;
      uStack_868._4_4_ = auVar175._12_4_;
      fVar13 = uStack_868._4_4_;
      local_870 = auVar175._0_8_;
      uStack_868 = auVar175._8_8_;
      local_5a0 = auVar111._0_4_;
      fStack_51c = local_520;
      fStack_518 = local_520;
      fStack_514 = local_520;
      fStack_510 = local_520;
      fStack_50c = local_520;
      fStack_508 = local_520;
      fStack_504 = local_520;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar214 = ZEXT3264(local_740);
        auVar141 = ZEXT3264(local_720);
        auVar164 = ZEXT3264(local_6c0);
      }
      else {
        local_640 = SUB84(pGVar9,0);
        uStack_63c = (undefined4)((ulong)pGVar9 >> 0x20);
        _local_4c0 = vandps_avx(auVar199,auVar110);
        fVar124 = auVar105._0_4_;
        fVar142 = auVar105._4_4_;
        auVar17._4_4_ = fVar142 * fVar219;
        auVar17._0_4_ = fVar124 * fVar218;
        auVar17._8_4_ = fVar124 * fVar220;
        auVar17._12_4_ = fVar142 * fVar221;
        auVar17._16_4_ = fVar124 * fVar123;
        auVar17._20_4_ = fVar142 * fVar80;
        auVar17._24_4_ = fVar124 * fVar81;
        auVar17._28_4_ = local_4c0._28_4_;
        auVar175 = vfmadd213ps_fma(auVar132,auVar208,auVar17);
        auVar175 = vfmadd213ps_fma(auVar223,local_740,ZEXT1632(auVar175));
        auVar175 = vfmadd213ps_fma(auVar7,auVar161,ZEXT1632(auVar175));
        auVar112._0_4_ = fVar124 * local_900;
        auVar112._4_4_ = fVar142 * fStack_8fc;
        auVar112._8_4_ = fVar124 * fStack_8f8;
        auVar112._12_4_ = fVar142 * fStack_8f4;
        auVar112._16_4_ = fVar124 * fStack_8f0;
        auVar112._20_4_ = fVar142 * fStack_8ec;
        auVar112._24_4_ = fVar124 * fStack_8e8;
        auVar112._28_4_ = 0;
        auVar105 = vfmadd213ps_fma(auVar109,auVar208,auVar112);
        auVar105 = vfmadd213ps_fma(auVar117,local_740,ZEXT1632(auVar105));
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar223 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        fVar216 = *(float *)(bspline_basis0 + lVar23 + 0x1f9c);
        fVar217 = *(float *)(bspline_basis0 + lVar23 + 0x1fa0);
        fVar218 = *(float *)(bspline_basis0 + lVar23 + 0x1fa4);
        fVar219 = *(float *)(bspline_basis0 + lVar23 + 0x1fa8);
        fVar220 = *(float *)(bspline_basis0 + lVar23 + 0x1fac);
        fVar221 = *(float *)(bspline_basis0 + lVar23 + 0x1fb0);
        fVar123 = *(float *)(bspline_basis0 + lVar23 + 0x1fb4);
        auVar186._0_4_ = local_520 * fVar216;
        auVar186._4_4_ = local_520 * fVar217;
        auVar186._8_4_ = local_520 * fVar218;
        auVar186._12_4_ = local_520 * fVar219;
        auVar186._16_4_ = local_520 * fVar220;
        auVar186._20_4_ = local_520 * fVar221;
        auVar186._24_4_ = local_520 * fVar123;
        auVar186._28_4_ = 0;
        auVar18._4_4_ = fVar190 * fVar217;
        auVar18._0_4_ = fVar182 * fVar216;
        auVar18._8_4_ = fVar182 * fVar218;
        auVar18._12_4_ = fVar190 * fVar219;
        auVar18._16_4_ = fVar182 * fVar220;
        auVar18._20_4_ = fVar190 * fVar221;
        auVar18._24_4_ = fVar182 * fVar123;
        auVar18._28_4_ = auVar117._28_4_;
        auVar19._4_4_ = fVar217 * fVar142;
        auVar19._0_4_ = fVar216 * fVar124;
        auVar19._8_4_ = fVar218 * fVar124;
        auVar19._12_4_ = fVar219 * fVar142;
        auVar19._16_4_ = fVar220 * fVar124;
        auVar19._20_4_ = fVar221 * fVar142;
        auVar19._24_4_ = fVar123 * fVar124;
        auVar19._28_4_ = auVar104._4_4_;
        auVar104 = vfmadd231ps_fma(auVar186,auVar223,local_720);
        auVar126 = vfmadd231ps_fma(auVar18,auVar223,local_6c0);
        auVar103 = vfmadd231ps_fma(auVar19,auVar208,auVar223);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar132,auVar178);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar132,local_560);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_740,auVar132);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar109,auVar229);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar109,local_540);
        auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar109,auVar161);
        fVar216 = *(float *)(bspline_basis1 + lVar23 + 0x1f9c);
        fVar217 = *(float *)(bspline_basis1 + lVar23 + 0x1fa0);
        fVar218 = *(float *)(bspline_basis1 + lVar23 + 0x1fa4);
        fVar219 = *(float *)(bspline_basis1 + lVar23 + 0x1fa8);
        fVar220 = *(float *)(bspline_basis1 + lVar23 + 0x1fac);
        fVar221 = *(float *)(bspline_basis1 + lVar23 + 0x1fb0);
        fVar123 = *(float *)(bspline_basis1 + lVar23 + 0x1fb4);
        auVar132._4_4_ = local_520 * fVar217;
        auVar132._0_4_ = local_520 * fVar216;
        auVar132._8_4_ = local_520 * fVar218;
        auVar132._12_4_ = local_520 * fVar219;
        auVar132._16_4_ = local_520 * fVar220;
        auVar132._20_4_ = local_520 * fVar221;
        auVar132._24_4_ = local_520 * fVar123;
        auVar132._28_4_ = local_520;
        auVar179._4_4_ = fVar190 * fVar217;
        auVar179._0_4_ = fVar182 * fVar216;
        auVar179._8_4_ = fVar182 * fVar218;
        auVar179._12_4_ = fVar190 * fVar219;
        auVar179._16_4_ = fVar182 * fVar220;
        auVar179._20_4_ = fVar190 * fVar221;
        auVar179._24_4_ = fVar182 * fVar123;
        auVar179._28_4_ = fVar190;
        auVar25._4_4_ = fVar142 * fVar217;
        auVar25._0_4_ = fVar124 * fVar216;
        auVar25._8_4_ = fVar124 * fVar218;
        auVar25._12_4_ = fVar142 * fVar219;
        auVar25._16_4_ = fVar124 * fVar220;
        auVar25._20_4_ = fVar142 * fVar221;
        auVar25._24_4_ = fVar124 * fVar123;
        auVar25._28_4_ = fVar142;
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar127 = vfmadd231ps_fma(auVar132,auVar109,local_720);
        auVar160 = vfmadd231ps_fma(auVar179,auVar109,local_6c0);
        auVar166 = vfmadd231ps_fma(auVar25,auVar208,auVar109);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar109,auVar178);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar109,local_560);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_740,auVar109);
        auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar109,auVar229);
        auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar109,local_540);
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar129._16_4_ = 0x7fffffff;
        auVar129._20_4_ = 0x7fffffff;
        auVar129._24_4_ = 0x7fffffff;
        auVar129._28_4_ = 0x7fffffff;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar161,auVar109);
        auVar109 = vandps_avx(ZEXT1632(auVar104),auVar129);
        auVar117 = vandps_avx(ZEXT1632(auVar126),auVar129);
        auVar117 = vmaxps_avx(auVar109,auVar117);
        auVar109 = vandps_avx(ZEXT1632(auVar103),auVar129);
        auVar109 = vmaxps_avx(auVar117,auVar109);
        auVar154._4_4_ = fVar210;
        auVar154._0_4_ = fVar210;
        auVar154._8_4_ = fVar210;
        auVar154._12_4_ = fVar210;
        auVar154._16_4_ = fVar210;
        auVar154._20_4_ = fVar210;
        auVar154._24_4_ = fVar210;
        auVar154._28_4_ = fVar210;
        auVar109 = vcmpps_avx(auVar109,auVar154,1);
        auVar132 = vblendvps_avx(ZEXT1632(auVar104),local_580,auVar109);
        auVar223 = vblendvps_avx(ZEXT1632(auVar126),local_4a0,auVar109);
        auVar109 = vandps_avx(ZEXT1632(auVar127),auVar129);
        auVar117 = vandps_avx(ZEXT1632(auVar160),auVar129);
        auVar7 = vmaxps_avx(auVar109,auVar117);
        auVar109 = vandps_avx(ZEXT1632(auVar166),auVar129);
        auVar109 = vmaxps_avx(auVar7,auVar109);
        auVar199 = vcmpps_avx(auVar109,auVar154,1);
        auVar109 = vblendvps_avx(ZEXT1632(auVar127),local_580,auVar199);
        auVar7 = vblendvps_avx(ZEXT1632(auVar160),local_4a0,auVar199);
        auVar105 = vfmadd213ps_fma(auVar116,auVar161,ZEXT1632(auVar105));
        auVar104 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar223,auVar223);
        auVar116 = vrsqrtps_avx(ZEXT1632(auVar104));
        fVar216 = auVar116._0_4_;
        fVar217 = auVar116._4_4_;
        fVar218 = auVar116._8_4_;
        fVar219 = auVar116._12_4_;
        fVar220 = auVar116._16_4_;
        fVar221 = auVar116._20_4_;
        fVar123 = auVar116._24_4_;
        auVar26._4_4_ = fVar217 * fVar217 * fVar217 * auVar104._4_4_ * -0.5;
        auVar26._0_4_ = fVar216 * fVar216 * fVar216 * auVar104._0_4_ * -0.5;
        auVar26._8_4_ = fVar218 * fVar218 * fVar218 * auVar104._8_4_ * -0.5;
        auVar26._12_4_ = fVar219 * fVar219 * fVar219 * auVar104._12_4_ * -0.5;
        auVar26._16_4_ = fVar220 * fVar220 * fVar220 * -0.0;
        auVar26._20_4_ = fVar221 * fVar221 * fVar221 * -0.0;
        auVar26._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar26._28_4_ = 0;
        auVar230._8_4_ = 0x3fc00000;
        auVar230._0_8_ = 0x3fc000003fc00000;
        auVar230._12_4_ = 0x3fc00000;
        auVar230._16_4_ = 0x3fc00000;
        auVar230._20_4_ = 0x3fc00000;
        auVar230._24_4_ = 0x3fc00000;
        auVar230._28_4_ = 0x3fc00000;
        auVar104 = vfmadd231ps_fma(auVar26,auVar230,auVar116);
        fVar216 = auVar104._0_4_;
        fVar217 = auVar104._4_4_;
        auVar27._4_4_ = auVar223._4_4_ * fVar217;
        auVar27._0_4_ = auVar223._0_4_ * fVar216;
        fVar218 = auVar104._8_4_;
        auVar27._8_4_ = auVar223._8_4_ * fVar218;
        fVar219 = auVar104._12_4_;
        auVar27._12_4_ = auVar223._12_4_ * fVar219;
        auVar27._16_4_ = auVar223._16_4_ * 0.0;
        auVar27._20_4_ = auVar223._20_4_ * 0.0;
        auVar27._24_4_ = auVar223._24_4_ * 0.0;
        auVar27._28_4_ = auVar116._28_4_;
        auVar28._4_4_ = fVar217 * -auVar132._4_4_;
        auVar28._0_4_ = fVar216 * -auVar132._0_4_;
        auVar28._8_4_ = fVar218 * -auVar132._8_4_;
        auVar28._12_4_ = fVar219 * -auVar132._12_4_;
        auVar28._16_4_ = -auVar132._16_4_ * 0.0;
        auVar28._20_4_ = -auVar132._20_4_ * 0.0;
        auVar28._24_4_ = -auVar132._24_4_ * 0.0;
        auVar28._28_4_ = auVar117._28_4_;
        auVar104 = vfmadd213ps_fma(auVar109,auVar109,ZEXT832(0) << 0x20);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar7,auVar7);
        auVar117 = vrsqrtps_avx(ZEXT1632(auVar104));
        auVar29._28_4_ = auVar199._28_4_;
        auVar29._0_28_ =
             ZEXT1628(CONCAT412(fVar219 * 0.0,
                                CONCAT48(fVar218 * 0.0,CONCAT44(fVar217 * 0.0,fVar216 * 0.0))));
        fVar216 = auVar117._0_4_;
        fVar217 = auVar117._4_4_;
        fVar218 = auVar117._8_4_;
        fVar219 = auVar117._12_4_;
        fVar220 = auVar117._16_4_;
        fVar221 = auVar117._20_4_;
        fVar123 = auVar117._24_4_;
        auVar30._4_4_ = fVar217 * fVar217 * fVar217 * auVar104._4_4_ * -0.5;
        auVar30._0_4_ = fVar216 * fVar216 * fVar216 * auVar104._0_4_ * -0.5;
        auVar30._8_4_ = fVar218 * fVar218 * fVar218 * auVar104._8_4_ * -0.5;
        auVar30._12_4_ = fVar219 * fVar219 * fVar219 * auVar104._12_4_ * -0.5;
        auVar30._16_4_ = fVar220 * fVar220 * fVar220 * -0.0;
        auVar30._20_4_ = fVar221 * fVar221 * fVar221 * -0.0;
        auVar30._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar30._28_4_ = 0;
        auVar104 = vfmadd231ps_fma(auVar30,auVar230,auVar117);
        fVar216 = auVar104._0_4_;
        fVar217 = auVar104._4_4_;
        auVar31._4_4_ = auVar7._4_4_ * fVar217;
        auVar31._0_4_ = auVar7._0_4_ * fVar216;
        fVar218 = auVar104._8_4_;
        auVar31._8_4_ = auVar7._8_4_ * fVar218;
        fVar219 = auVar104._12_4_;
        auVar31._12_4_ = auVar7._12_4_ * fVar219;
        auVar31._16_4_ = auVar7._16_4_ * 0.0;
        auVar31._20_4_ = auVar7._20_4_ * 0.0;
        auVar31._24_4_ = auVar7._24_4_ * 0.0;
        auVar31._28_4_ = 0;
        auVar32._4_4_ = -auVar109._4_4_ * fVar217;
        auVar32._0_4_ = -auVar109._0_4_ * fVar216;
        auVar32._8_4_ = -auVar109._8_4_ * fVar218;
        auVar32._12_4_ = -auVar109._12_4_ * fVar219;
        auVar32._16_4_ = -auVar109._16_4_ * 0.0;
        auVar32._20_4_ = -auVar109._20_4_ * 0.0;
        auVar32._24_4_ = -auVar109._24_4_ * 0.0;
        auVar32._28_4_ = auVar7._28_4_;
        auVar33._28_4_ = auVar117._28_4_;
        auVar33._0_28_ =
             ZEXT1628(CONCAT412(fVar219 * 0.0,
                                CONCAT48(fVar218 * 0.0,CONCAT44(fVar217 * 0.0,fVar216 * 0.0))));
        auVar104 = vfmadd213ps_fma(auVar27,ZEXT1632(auVar143),local_440);
        auVar109 = ZEXT1632(auVar143);
        auVar126 = vfmadd213ps_fma(auVar28,auVar109,local_480);
        auVar103 = vfmadd213ps_fma(auVar29,auVar109,ZEXT1632(auVar105));
        auVar166 = vfnmadd213ps_fma(auVar27,auVar109,local_440);
        auVar127 = vfmadd213ps_fma(auVar31,auVar156,local_460);
        auVar102 = vfnmadd213ps_fma(auVar28,auVar109,local_480);
        auVar160 = vfmadd213ps_fma(auVar32,auVar156,_local_5c0);
        auVar179 = ZEXT1632(auVar143);
        auVar183 = vfnmadd231ps_fma(ZEXT1632(auVar105),auVar179,auVar29);
        auVar105 = vfmadd213ps_fma(auVar33,auVar156,ZEXT1632(auVar175));
        auVar125 = vfnmadd213ps_fma(auVar31,auVar156,local_460);
        auVar165 = vfnmadd213ps_fma(auVar32,auVar156,_local_5c0);
        auVar184 = vfnmadd231ps_fma(ZEXT1632(auVar175),auVar156,auVar33);
        auVar109 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar102));
        auVar117 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar183));
        auVar34._4_4_ = auVar183._4_4_ * auVar109._4_4_;
        auVar34._0_4_ = auVar183._0_4_ * auVar109._0_4_;
        auVar34._8_4_ = auVar183._8_4_ * auVar109._8_4_;
        auVar34._12_4_ = auVar183._12_4_ * auVar109._12_4_;
        auVar34._16_4_ = auVar109._16_4_ * 0.0;
        auVar34._20_4_ = auVar109._20_4_ * 0.0;
        auVar34._24_4_ = auVar109._24_4_ * 0.0;
        auVar34._28_4_ = 0;
        auVar143 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar102),auVar117);
        auVar35._4_4_ = auVar166._4_4_ * auVar117._4_4_;
        auVar35._0_4_ = auVar166._0_4_ * auVar117._0_4_;
        auVar35._8_4_ = auVar166._8_4_ * auVar117._8_4_;
        auVar35._12_4_ = auVar166._12_4_ * auVar117._12_4_;
        auVar35._16_4_ = auVar117._16_4_ * 0.0;
        auVar35._20_4_ = auVar117._20_4_ * 0.0;
        auVar35._24_4_ = auVar117._24_4_ * 0.0;
        auVar35._28_4_ = auVar117._28_4_;
        auVar199 = ZEXT1632(auVar166);
        auVar117 = vsubps_avx(ZEXT1632(auVar127),auVar199);
        auVar175 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar183),auVar117);
        auVar36._4_4_ = auVar102._4_4_ * auVar117._4_4_;
        auVar36._0_4_ = auVar102._0_4_ * auVar117._0_4_;
        auVar36._8_4_ = auVar102._8_4_ * auVar117._8_4_;
        auVar36._12_4_ = auVar102._12_4_ * auVar117._12_4_;
        auVar36._16_4_ = auVar117._16_4_ * 0.0;
        auVar36._20_4_ = auVar117._20_4_ * 0.0;
        auVar36._24_4_ = auVar117._24_4_ * 0.0;
        auVar36._28_4_ = auVar117._28_4_;
        auVar166 = vfmsub231ps_fma(auVar36,auVar199,auVar109);
        auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar175 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar109,ZEXT1632(auVar175));
        auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar109,ZEXT1632(auVar143));
        auVar22 = vcmpps_avx(ZEXT1632(auVar175),ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar109 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar104),auVar22);
        auVar117 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar126),auVar22);
        auVar116 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar103),auVar22);
        auVar132 = vblendvps_avx(auVar199,ZEXT1632(auVar127),auVar22);
        auVar223 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar160),auVar22);
        auVar7 = vblendvps_avx(ZEXT1632(auVar183),ZEXT1632(auVar105),auVar22);
        auVar199 = vblendvps_avx(ZEXT1632(auVar127),auVar199,auVar22);
        auVar110 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar102),auVar22);
        auVar175 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar183),auVar22);
        auVar20 = vsubps_avx(auVar199,auVar109);
        auVar110 = vsubps_avx(auVar110,auVar117);
        auVar128 = vsubps_avx(auVar21,auVar116);
        auVar17 = vsubps_avx(auVar109,auVar132);
        auVar18 = vsubps_avx(auVar117,auVar223);
        auVar19 = vsubps_avx(auVar116,auVar7);
        auVar37._4_4_ = auVar128._4_4_ * auVar109._4_4_;
        auVar37._0_4_ = auVar128._0_4_ * auVar109._0_4_;
        auVar37._8_4_ = auVar128._8_4_ * auVar109._8_4_;
        auVar37._12_4_ = auVar128._12_4_ * auVar109._12_4_;
        auVar37._16_4_ = auVar128._16_4_ * auVar109._16_4_;
        auVar37._20_4_ = auVar128._20_4_ * auVar109._20_4_;
        auVar37._24_4_ = auVar128._24_4_ * auVar109._24_4_;
        auVar37._28_4_ = auVar21._28_4_;
        auVar105 = vfmsub231ps_fma(auVar37,auVar116,auVar20);
        auVar38._4_4_ = auVar20._4_4_ * auVar117._4_4_;
        auVar38._0_4_ = auVar20._0_4_ * auVar117._0_4_;
        auVar38._8_4_ = auVar20._8_4_ * auVar117._8_4_;
        auVar38._12_4_ = auVar20._12_4_ * auVar117._12_4_;
        auVar38._16_4_ = auVar20._16_4_ * auVar117._16_4_;
        auVar38._20_4_ = auVar20._20_4_ * auVar117._20_4_;
        auVar38._24_4_ = auVar20._24_4_ * auVar117._24_4_;
        auVar38._28_4_ = auVar199._28_4_;
        auVar104 = vfmsub231ps_fma(auVar38,auVar109,auVar110);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
        auVar113._0_4_ = auVar110._0_4_ * auVar116._0_4_;
        auVar113._4_4_ = auVar110._4_4_ * auVar116._4_4_;
        auVar113._8_4_ = auVar110._8_4_ * auVar116._8_4_;
        auVar113._12_4_ = auVar110._12_4_ * auVar116._12_4_;
        auVar113._16_4_ = auVar110._16_4_ * auVar116._16_4_;
        auVar113._20_4_ = auVar110._20_4_ * auVar116._20_4_;
        auVar113._24_4_ = auVar110._24_4_ * auVar116._24_4_;
        auVar113._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar113,auVar117,auVar128);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar104));
        auVar114._0_4_ = auVar19._0_4_ * auVar132._0_4_;
        auVar114._4_4_ = auVar19._4_4_ * auVar132._4_4_;
        auVar114._8_4_ = auVar19._8_4_ * auVar132._8_4_;
        auVar114._12_4_ = auVar19._12_4_ * auVar132._12_4_;
        auVar114._16_4_ = auVar19._16_4_ * auVar132._16_4_;
        auVar114._20_4_ = auVar19._20_4_ * auVar132._20_4_;
        auVar114._24_4_ = auVar19._24_4_ * auVar132._24_4_;
        auVar114._28_4_ = 0;
        auVar105 = vfmsub231ps_fma(auVar114,auVar17,auVar7);
        auVar39._4_4_ = auVar18._4_4_ * auVar7._4_4_;
        auVar39._0_4_ = auVar18._0_4_ * auVar7._0_4_;
        auVar39._8_4_ = auVar18._8_4_ * auVar7._8_4_;
        auVar39._12_4_ = auVar18._12_4_ * auVar7._12_4_;
        auVar39._16_4_ = auVar18._16_4_ * auVar7._16_4_;
        auVar39._20_4_ = auVar18._20_4_ * auVar7._20_4_;
        auVar39._24_4_ = auVar18._24_4_ * auVar7._24_4_;
        auVar39._28_4_ = auVar7._28_4_;
        auVar143 = vfmsub231ps_fma(auVar39,auVar223,auVar19);
        auVar40._4_4_ = auVar17._4_4_ * auVar223._4_4_;
        auVar40._0_4_ = auVar17._0_4_ * auVar223._0_4_;
        auVar40._8_4_ = auVar17._8_4_ * auVar223._8_4_;
        auVar40._12_4_ = auVar17._12_4_ * auVar223._12_4_;
        auVar40._16_4_ = auVar17._16_4_ * auVar223._16_4_;
        auVar40._20_4_ = auVar17._20_4_ * auVar223._20_4_;
        auVar40._24_4_ = auVar17._24_4_ * auVar223._24_4_;
        auVar40._28_4_ = auVar223._28_4_;
        auVar126 = vfmsub231ps_fma(auVar40,auVar18,auVar132);
        auVar223 = ZEXT832(0) << 0x20;
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar223,ZEXT1632(auVar105));
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar223,ZEXT1632(auVar143));
        auVar132 = vmaxps_avx(ZEXT1632(auVar104),ZEXT1632(auVar143));
        auVar132 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,2);
        auVar105 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar175 = vpand_avx(auVar175,auVar105);
        auVar132 = vpmovsxwd_avx2(auVar175);
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0x7f,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0xbf,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar132[0x1f]) {
LAB_015ca624:
          auVar181._8_8_ = local_680[1]._8_8_;
          auVar181._0_8_ = local_680[1]._0_8_;
          auVar181._16_8_ = local_680[1]._16_8_;
          auVar181._24_8_ = local_680[1]._24_8_;
        }
        else {
          auVar41._4_4_ = auVar110._4_4_ * auVar19._4_4_;
          auVar41._0_4_ = auVar110._0_4_ * auVar19._0_4_;
          auVar41._8_4_ = auVar110._8_4_ * auVar19._8_4_;
          auVar41._12_4_ = auVar110._12_4_ * auVar19._12_4_;
          auVar41._16_4_ = auVar110._16_4_ * auVar19._16_4_;
          auVar41._20_4_ = auVar110._20_4_ * auVar19._20_4_;
          auVar41._24_4_ = auVar110._24_4_ * auVar19._24_4_;
          auVar41._28_4_ = auVar132._28_4_;
          auVar127 = vfmsub231ps_fma(auVar41,auVar18,auVar128);
          auVar130._0_4_ = auVar17._0_4_ * auVar128._0_4_;
          auVar130._4_4_ = auVar17._4_4_ * auVar128._4_4_;
          auVar130._8_4_ = auVar17._8_4_ * auVar128._8_4_;
          auVar130._12_4_ = auVar17._12_4_ * auVar128._12_4_;
          auVar130._16_4_ = auVar17._16_4_ * auVar128._16_4_;
          auVar130._20_4_ = auVar17._20_4_ * auVar128._20_4_;
          auVar130._24_4_ = auVar17._24_4_ * auVar128._24_4_;
          auVar130._28_4_ = 0;
          auVar103 = vfmsub231ps_fma(auVar130,auVar20,auVar19);
          auVar42._4_4_ = auVar20._4_4_ * auVar18._4_4_;
          auVar42._0_4_ = auVar20._0_4_ * auVar18._0_4_;
          auVar42._8_4_ = auVar20._8_4_ * auVar18._8_4_;
          auVar42._12_4_ = auVar20._12_4_ * auVar18._12_4_;
          auVar42._16_4_ = auVar20._16_4_ * auVar18._16_4_;
          auVar42._20_4_ = auVar20._20_4_ * auVar18._20_4_;
          auVar42._24_4_ = auVar20._24_4_ * auVar18._24_4_;
          auVar42._28_4_ = auVar20._28_4_;
          auVar160 = vfmsub231ps_fma(auVar42,auVar17,auVar110);
          auVar105 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar160));
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar127),auVar223);
          auVar132 = vrcpps_avx(ZEXT1632(auVar126));
          auVar213._8_4_ = 0x3f800000;
          auVar213._0_8_ = 0x3f8000003f800000;
          auVar213._12_4_ = 0x3f800000;
          auVar213._16_4_ = 0x3f800000;
          auVar213._20_4_ = 0x3f800000;
          auVar213._24_4_ = 0x3f800000;
          auVar213._28_4_ = 0x3f800000;
          auVar105 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar126),auVar213);
          auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar132,auVar132);
          auVar43._4_4_ = auVar160._4_4_ * auVar116._4_4_;
          auVar43._0_4_ = auVar160._0_4_ * auVar116._0_4_;
          auVar43._8_4_ = auVar160._8_4_ * auVar116._8_4_;
          auVar43._12_4_ = auVar160._12_4_ * auVar116._12_4_;
          auVar43._16_4_ = auVar116._16_4_ * 0.0;
          auVar43._20_4_ = auVar116._20_4_ * 0.0;
          auVar43._24_4_ = auVar116._24_4_ * 0.0;
          auVar43._28_4_ = auVar116._28_4_;
          auVar103 = vfmadd231ps_fma(auVar43,auVar117,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar127),auVar109);
          fVar216 = auVar105._0_4_;
          fVar217 = auVar105._4_4_;
          fVar218 = auVar105._8_4_;
          fVar219 = auVar105._12_4_;
          auVar44._28_4_ = auVar117._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar219 * auVar103._12_4_,
                                  CONCAT48(fVar218 * auVar103._8_4_,
                                           CONCAT44(fVar217 * auVar103._4_4_,
                                                    fVar216 * auVar103._0_4_))));
          auVar115._4_4_ = uVar96;
          auVar115._0_4_ = uVar96;
          auVar115._8_4_ = uVar96;
          auVar115._12_4_ = uVar96;
          auVar115._16_4_ = uVar96;
          auVar115._20_4_ = uVar96;
          auVar115._24_4_ = uVar96;
          auVar115._28_4_ = uVar96;
          uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar131._4_4_ = uVar100;
          auVar131._0_4_ = uVar100;
          auVar131._8_4_ = uVar100;
          auVar131._12_4_ = uVar100;
          auVar131._16_4_ = uVar100;
          auVar131._20_4_ = uVar100;
          auVar131._24_4_ = uVar100;
          auVar131._28_4_ = uVar100;
          auVar109 = vcmpps_avx(auVar115,auVar44,2);
          auVar117 = vcmpps_avx(auVar44,auVar131,2);
          auVar109 = vandps_avx(auVar117,auVar109);
          auVar105 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar175 = vpand_avx(auVar175,auVar105);
          auVar109 = vpmovsxwd_avx2(auVar175);
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0x7f,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0xbf,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar109[0x1f]) goto LAB_015ca624;
          auVar109 = vcmpps_avx(auVar223,ZEXT1632(auVar126),4);
          auVar105 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
          auVar175 = vpand_avx(auVar175,auVar105);
          auVar109 = vpmovsxwd_avx2(auVar175);
          auVar181._8_8_ = local_680[1]._8_8_;
          auVar181._0_8_ = local_680[1]._0_8_;
          auVar181._16_8_ = local_680[1]._16_8_;
          auVar181._24_8_ = local_680[1]._24_8_;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            auVar116 = ZEXT1632(CONCAT412(fVar219 * auVar104._12_4_,
                                          CONCAT48(fVar218 * auVar104._8_4_,
                                                   CONCAT44(fVar217 * auVar104._4_4_,
                                                            fVar216 * auVar104._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar219 * auVar143._12_4_,
                                          CONCAT48(fVar218 * auVar143._8_4_,
                                                   CONCAT44(fVar217 * auVar143._4_4_,
                                                            fVar216 * auVar143._0_4_))));
            auVar180._8_4_ = 0x3f800000;
            auVar180._0_8_ = 0x3f8000003f800000;
            auVar180._12_4_ = 0x3f800000;
            auVar180._16_4_ = 0x3f800000;
            auVar180._20_4_ = 0x3f800000;
            auVar180._24_4_ = 0x3f800000;
            auVar180._28_4_ = 0x3f800000;
            auVar117 = vsubps_avx(auVar180,auVar116);
            _local_2a0 = vblendvps_avx(auVar117,auVar116,auVar22);
            auVar117 = vsubps_avx(auVar180,auVar132);
            local_4e0 = vblendvps_avx(auVar117,auVar132,auVar22);
            auVar181 = auVar109;
            local_5e0 = auVar44;
          }
        }
        auVar225 = ZEXT3264(_local_700);
        auVar214 = ZEXT3264(local_740);
        auVar164 = ZEXT3264(auVar208);
        auVar141 = ZEXT3264(auVar161);
        if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar181 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar181 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar181 >> 0x7f,0) == '\0') &&
              (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar181 >> 0xbf,0) == '\0') &&
            (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar181[0x1f]) {
          auVar141 = ZEXT3264(local_720);
          auVar164 = ZEXT3264(local_6c0);
        }
        else {
          auVar109 = vsubps_avx(auVar156,auVar179);
          auVar175 = vfmadd213ps_fma(auVar109,_local_2a0,auVar179);
          fVar216 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar45._4_4_ = (auVar175._4_4_ + auVar175._4_4_) * fVar216;
          auVar45._0_4_ = (auVar175._0_4_ + auVar175._0_4_) * fVar216;
          auVar45._8_4_ = (auVar175._8_4_ + auVar175._8_4_) * fVar216;
          auVar45._12_4_ = (auVar175._12_4_ + auVar175._12_4_) * fVar216;
          auVar45._16_4_ = fVar216 * 0.0;
          auVar45._20_4_ = fVar216 * 0.0;
          auVar45._24_4_ = fVar216 * 0.0;
          auVar45._28_4_ = 0;
          auVar109 = vcmpps_avx(local_5e0,auVar45,6);
          auVar117 = auVar181 & auVar109;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            auVar141 = ZEXT3264(local_720);
            auVar164 = ZEXT3264(local_6c0);
          }
          else {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar155._8_4_ = 0x40000000;
            auVar155._0_8_ = 0x4000000040000000;
            auVar155._12_4_ = 0x40000000;
            auVar155._16_4_ = 0x40000000;
            auVar155._20_4_ = 0x40000000;
            auVar155._24_4_ = 0x40000000;
            auVar155._28_4_ = 0x40000000;
            auVar175 = vfmadd213ps_fma(local_4e0,auVar155,auVar133);
            local_400 = _local_2a0;
            local_3e0 = ZEXT1632(auVar175);
            local_3c0 = local_5e0;
            local_3a0 = 0;
            local_380 = local_850;
            uStack_378 = uStack_848;
            local_370 = local_860;
            uStack_368 = uStack_858;
            local_360 = local_870;
            uStack_358 = uStack_868;
            local_4e0 = local_3e0;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar109,auVar181);
              fVar216 = 1.0 / auVar111._0_4_;
              local_320[0] = fVar216 * ((float)local_2a0._0_4_ + 0.0);
              local_320[1] = fVar216 * ((float)local_2a0._4_4_ + 1.0);
              local_320[2] = fVar216 * (fStack_298 + 2.0);
              local_320[3] = fVar216 * (fStack_294 + 3.0);
              fStack_310 = fVar216 * (fStack_290 + 4.0);
              fStack_30c = fVar216 * (fStack_28c + 5.0);
              fStack_308 = fVar216 * (fStack_288 + 6.0);
              fStack_304 = fStack_284 + 7.0;
              local_4e0._0_8_ = auVar175._0_8_;
              local_4e0._8_8_ = auVar175._8_8_;
              local_300 = local_4e0._0_8_;
              uStack_2f8 = local_4e0._8_8_;
              uStack_2f0 = 0;
              uStack_2e8 = 0;
              local_2e0 = local_5e0;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar109 = vblendvps_avx(auVar134,local_5e0,local_6a0);
              auVar117 = vshufps_avx(auVar109,auVar109,0xb1);
              auVar117 = vminps_avx(auVar109,auVar117);
              auVar116 = vshufpd_avx(auVar117,auVar117,5);
              auVar117 = vminps_avx(auVar117,auVar116);
              auVar116 = vpermpd_avx2(auVar117,0x4e);
              auVar117 = vminps_avx(auVar117,auVar116);
              auVar117 = vcmpps_avx(auVar109,auVar117,0);
              auVar116 = local_6a0 & auVar117;
              auVar109 = local_6a0;
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar116 >> 0x7f,0) != '\0') ||
                    (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0xbf,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar116[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar117,local_6a0);
              }
              uVar94 = vmovmskps_avx(auVar109);
              uVar96 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                uVar96 = uVar96 + 1;
              }
              uVar95 = (ulong)uVar96;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar216 = local_320[uVar95];
                uVar100 = *(undefined4 *)((long)&local_300 + uVar95 * 4);
                fVar217 = 1.0 - fVar216;
                auVar170 = ZEXT416((uint)(fVar216 * fVar217 * 4.0));
                auVar175 = vfnmsub213ss_fma(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),auVar170);
                auVar170 = vfmadd213ss_fma(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),auVar170);
                fVar217 = fVar217 * -fVar217 * 0.5;
                fVar218 = auVar175._0_4_ * 0.5;
                fVar219 = auVar170._0_4_ * 0.5;
                fVar220 = fVar216 * fVar216 * 0.5;
                auVar168._0_4_ = fVar220 * fVar120;
                auVar168._4_4_ = fVar220 * fVar121;
                auVar168._8_4_ = fVar220 * fVar122;
                auVar168._12_4_ = fVar220 * fVar13;
                auVar144._4_4_ = fVar219;
                auVar144._0_4_ = fVar219;
                auVar144._8_4_ = fVar219;
                auVar144._12_4_ = fVar219;
                auVar170 = vfmadd132ps_fma(auVar144,auVar168,auVar16);
                auVar169._4_4_ = fVar218;
                auVar169._0_4_ = fVar218;
                auVar169._8_4_ = fVar218;
                auVar169._12_4_ = fVar218;
                auVar170 = vfmadd132ps_fma(auVar169,auVar170,auVar15);
                auVar145._4_4_ = fVar217;
                auVar145._0_4_ = fVar217;
                auVar145._8_4_ = fVar217;
                auVar145._12_4_ = fVar217;
                auVar170 = vfmadd132ps_fma(auVar145,auVar170,*(undefined1 (*) [16])pPVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar95 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar170._0_4_;
                uVar201 = vextractps_avx(auVar170,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar201;
                uVar201 = vextractps_avx(auVar170,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar201;
                *(float *)(ray + k * 4 + 0x1e0) = fVar216;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar100;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x240) = local_8a0._4_4_;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_8a0._0_4_ = local_8a0._4_4_;
                local_8a0._8_4_ = local_8a0._4_4_;
                local_8a0._12_4_ = local_8a0._4_4_;
                local_8a0._16_4_ = local_8a0._4_4_;
                local_8a0._20_4_ = local_8a0._4_4_;
                local_8a0._24_4_ = local_8a0._4_4_;
                local_8a0._28_4_ = local_8a0._4_4_;
                local_6e0._4_4_ = uVar4;
                local_6e0._0_4_ = uVar4;
                local_6e0._8_4_ = uVar4;
                local_6e0._12_4_ = uVar4;
                local_6e0._16_4_ = uVar4;
                local_6e0._20_4_ = uVar4;
                local_6e0._24_4_ = uVar4;
                local_6e0._28_4_ = uVar4;
                uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_7a0 = auVar161;
                local_760 = auVar208;
                local_39c = iVar93;
                local_390 = uVar89;
                uStack_388 = uVar90;
                while( true ) {
                  fVar216 = local_320[uVar95];
                  auVar108._4_4_ = fVar216;
                  auVar108._0_4_ = fVar216;
                  auVar108._8_4_ = fVar216;
                  auVar108._12_4_ = fVar216;
                  local_200._16_4_ = fVar216;
                  local_200._0_16_ = auVar108;
                  local_200._20_4_ = fVar216;
                  local_200._24_4_ = fVar216;
                  local_200._28_4_ = fVar216;
                  local_1e0 = *(undefined4 *)((long)&local_300 + uVar95 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar95 * 4);
                  fVar218 = 1.0 - fVar216;
                  auVar175 = ZEXT416((uint)(fVar216 * fVar218 * 4.0));
                  auVar105 = vfnmsub213ss_fma(auVar108,auVar108,auVar175);
                  auVar175 = vfmadd213ss_fma(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),auVar175)
                  ;
                  fVar217 = auVar175._0_4_ * 0.5;
                  fVar216 = fVar216 * fVar216 * 0.5;
                  auVar176._0_4_ = fVar216 * fVar120;
                  auVar176._4_4_ = fVar216 * fVar121;
                  auVar176._8_4_ = fVar216 * fVar122;
                  auVar176._12_4_ = fVar216 * fVar13;
                  auVar151._4_4_ = fVar217;
                  auVar151._0_4_ = fVar217;
                  auVar151._8_4_ = fVar217;
                  auVar151._12_4_ = fVar217;
                  auVar175 = vfmadd132ps_fma(auVar151,auVar176,auVar16);
                  fVar216 = auVar105._0_4_ * 0.5;
                  auVar177._4_4_ = fVar216;
                  auVar177._0_4_ = fVar216;
                  auVar177._8_4_ = fVar216;
                  auVar177._12_4_ = fVar216;
                  auVar175 = vfmadd132ps_fma(auVar177,auVar175,auVar15);
                  local_7d0.context = context->user;
                  fVar216 = fVar218 * -fVar218 * 0.5;
                  auVar152._4_4_ = fVar216;
                  auVar152._0_4_ = fVar216;
                  auVar152._8_4_ = fVar216;
                  auVar152._12_4_ = fVar216;
                  auVar105 = vfmadd132ps_fma(auVar152,auVar175,auVar170);
                  local_260 = auVar105._0_4_;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  auVar175 = vmovshdup_avx(auVar105);
                  local_240 = auVar175._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  auVar175 = vshufps_avx(auVar105,auVar105,0xaa);
                  auVar153._0_8_ = auVar175._0_8_;
                  auVar153._8_8_ = auVar153._0_8_;
                  auVar159._16_8_ = auVar153._0_8_;
                  auVar159._0_16_ = auVar153;
                  auVar159._24_8_ = auVar153._0_8_;
                  local_220 = auVar159;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_6e0._0_8_;
                  uStack_1b8 = local_6e0._8_8_;
                  uStack_1b0 = local_6e0._16_8_;
                  uStack_1a8 = local_6e0._24_8_;
                  local_1a0 = local_8a0;
                  auVar109 = vpcmpeqd_avx2(local_8a0,local_8a0);
                  local_768[1] = auVar109;
                  *local_768 = auVar109;
                  local_180 = (local_7d0.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_7d0.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_680[0] = local_2c0;
                  local_7d0.valid = (int *)local_680;
                  local_7d0.geometryUserPtr = *(void **)(CONCAT44(uStack_63c,local_640) + 0x18);
                  local_7d0.hit = (RTCHitN *)&local_260;
                  local_7d0.N = 8;
                  pcVar11 = *(code **)(CONCAT44(uStack_63c,local_640) + 0x40);
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    auVar159 = ZEXT1632(auVar153);
                    (*pcVar11)(&local_7d0);
                    auVar225 = ZEXT3264(_local_700);
                    auVar164 = ZEXT3264(local_760);
                    auVar214 = ZEXT3264(local_740);
                    auVar141 = ZEXT3264(local_7a0);
                  }
                  auVar117 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                  auVar116 = vpcmpeqd_avx2(auVar159,auVar159);
                  auVar109 = auVar116 & ~auVar117;
                  if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar109 >> 0x7f,0) == '\0') &&
                        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar109 >> 0xbf,0) == '\0') &&
                      (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar109[0x1f]) {
                    auVar117 = auVar117 ^ auVar116;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_63c,local_640) + 0x3e) & 0x40) != 0)))) {
                      auVar116 = ZEXT1632(auVar116._0_16_);
                      (*p_Var10)(&local_7d0);
                      auVar225 = ZEXT3264(_local_700);
                      auVar164 = ZEXT3264(local_760);
                      auVar214 = ZEXT3264(local_740);
                      auVar141 = ZEXT3264(local_7a0);
                    }
                    auVar132 = vpcmpeqd_avx2(local_680[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                                            );
                    auVar116 = vpcmpeqd_avx2(auVar116,auVar116);
                    auVar117 = auVar132 ^ auVar116;
                    auVar109 = auVar116 & ~auVar132;
                    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar109 >> 0x7f,0) != '\0') ||
                          (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar109 >> 0xbf,0) != '\0') ||
                        (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar109[0x1f] < '\0') {
                      auVar139._0_4_ = auVar132._0_4_ ^ auVar116._0_4_;
                      auVar139._4_4_ = auVar132._4_4_ ^ auVar116._4_4_;
                      auVar139._8_4_ = auVar132._8_4_ ^ auVar116._8_4_;
                      auVar139._12_4_ = auVar132._12_4_ ^ auVar116._12_4_;
                      auVar139._16_4_ = auVar132._16_4_ ^ auVar116._16_4_;
                      auVar139._20_4_ = auVar132._20_4_ ^ auVar116._20_4_;
                      auVar139._24_4_ = auVar132._24_4_ ^ auVar116._24_4_;
                      auVar139._28_4_ = auVar132._28_4_ ^ auVar116._28_4_;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])local_7d0.hit);
                      *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar109;
                      auVar109 = vmaskmovps_avx(auVar139,*(undefined1 (*) [32])
                                                          (local_7d0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar109;
                      auVar109 = vpmaskmovd_avx2(auVar139,*(undefined1 (*) [32])
                                                           (local_7d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar109;
                    }
                  }
                  auVar109 = local_5e0;
                  auVar161 = auVar141._0_32_;
                  auVar208 = auVar164._0_32_;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar117 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar117[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar100;
                  }
                  else {
                    uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6a0 + uVar95 * 4) = 0;
                  auVar119._4_4_ = uVar100;
                  auVar119._0_4_ = uVar100;
                  auVar119._8_4_ = uVar100;
                  auVar119._12_4_ = uVar100;
                  auVar119._16_4_ = uVar100;
                  auVar119._20_4_ = uVar100;
                  auVar119._24_4_ = uVar100;
                  auVar119._28_4_ = uVar100;
                  auVar116 = vcmpps_avx(auVar109,auVar119,2);
                  auVar117 = vandps_avx(auVar116,local_6a0);
                  local_6a0 = local_6a0 & auVar116;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar109 = vblendvps_avx(auVar140,auVar109,auVar117);
                  auVar116 = vshufps_avx(auVar109,auVar109,0xb1);
                  auVar116 = vminps_avx(auVar109,auVar116);
                  auVar132 = vshufpd_avx(auVar116,auVar116,5);
                  auVar116 = vminps_avx(auVar116,auVar132);
                  auVar132 = vpermpd_avx2(auVar116,0x4e);
                  auVar116 = vminps_avx(auVar116,auVar132);
                  auVar116 = vcmpps_avx(auVar109,auVar116,0);
                  auVar132 = auVar117 & auVar116;
                  auVar109 = auVar117;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0x7f,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0xbf,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar132[0x1f] < '\0') {
                    auVar109 = vandps_avx(auVar116,auVar117);
                  }
                  uVar94 = vmovmskps_avx(auVar109);
                  uVar96 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar96 = uVar96 + 1;
                  }
                  uVar95 = (ulong)uVar96;
                  local_6a0 = auVar117;
                }
              }
            }
            auVar141 = ZEXT3264(local_720);
            auVar164 = ZEXT3264(local_6c0);
          }
        }
      }
      if (8 < iVar93) {
        _local_700 = auVar225._0_32_;
        local_740 = auVar214._0_32_;
        local_480._4_4_ = iVar93;
        local_480._0_4_ = iVar93;
        local_480._8_4_ = iVar93;
        local_480._12_4_ = iVar93;
        local_480._16_4_ = iVar93;
        local_480._20_4_ = iVar93;
        local_480._24_4_ = iVar93;
        local_480._28_4_ = iVar93;
        local_4c0._4_4_ = fVar210;
        local_4c0._0_4_ = fVar210;
        fStack_4b8 = fVar210;
        fStack_4b4 = fVar210;
        fStack_4b0 = fVar210;
        fStack_4ac = fVar210;
        fStack_4a8 = fVar210;
        fStack_4a4 = fVar210;
        local_640 = local_620._0_4_;
        uStack_63c = local_620._0_4_;
        uStack_638 = local_620._0_4_;
        uStack_634 = local_620._0_4_;
        uStack_630 = local_620._0_4_;
        uStack_62c = local_620._0_4_;
        uStack_628 = local_620._0_4_;
        uStack_624 = local_620._0_4_;
        local_140 = 1.0 / local_5a0;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_120 = uVar4;
        uStack_11c = uVar4;
        uStack_118 = uVar4;
        uStack_114 = uVar4;
        uStack_110 = uVar4;
        uStack_10c = uVar4;
        uStack_108 = uVar4;
        uStack_104 = uVar4;
        lVar98 = 8;
        local_7a0 = auVar161;
        local_760 = auVar208;
        local_5a0 = (float)local_8a0._4_4_;
        uStack_59c = local_8a0._4_4_;
        uStack_598 = local_8a0._4_4_;
        uStack_594 = local_8a0._4_4_;
        uStack_590 = local_8a0._4_4_;
        uStack_58c = local_8a0._4_4_;
        uStack_588 = local_8a0._4_4_;
        uStack_584 = local_8a0._4_4_;
        do {
          auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 * 4 + lVar23);
          auVar117 = *(undefined1 (*) [32])(lVar23 + 0x21aefac + lVar98 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar23 + 0x21af430 + lVar98 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar23 + 0x21af8b4 + lVar98 * 4);
          fVar123 = *(float *)*pauVar2;
          fVar80 = *(float *)(*pauVar2 + 4);
          fVar81 = *(float *)(*pauVar2 + 8);
          fVar124 = *(float *)(*pauVar2 + 0xc);
          fVar142 = *(float *)(*pauVar2 + 0x10);
          fVar182 = *(float *)(*pauVar2 + 0x14);
          fVar190 = *(float *)(*pauVar2 + 0x18);
          auVar92 = *pauVar2;
          auVar215._0_4_ = local_520 * fVar123;
          auVar215._4_4_ = fStack_51c * fVar80;
          auVar215._8_4_ = fStack_518 * fVar81;
          auVar215._12_4_ = fStack_514 * fVar124;
          auVar215._16_4_ = fStack_510 * fVar142;
          auVar215._20_4_ = fStack_50c * fVar182;
          auVar215._28_36_ = auVar214._28_36_;
          auVar215._24_4_ = fStack_508 * fVar190;
          auVar214._0_4_ = (float)local_280 * fVar123;
          auVar214._4_4_ = local_280._4_4_ * fVar80;
          auVar214._8_4_ = (float)uStack_278 * fVar81;
          auVar214._12_4_ = uStack_278._4_4_ * fVar124;
          auVar214._16_4_ = (float)uStack_270 * fVar142;
          auVar214._20_4_ = uStack_270._4_4_ * fVar182;
          auVar214._28_36_ = auVar225._28_36_;
          auVar214._24_4_ = (float)uStack_268 * fVar190;
          auVar170 = vfmadd231ps_fma(auVar215._0_32_,auVar116,auVar141._0_32_);
          auVar175 = vfmadd231ps_fma(auVar214._0_32_,auVar116,auVar164._0_32_);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar117,auVar178);
          auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar117,local_560);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar109,auVar229);
          auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar109,local_540);
          auVar132 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 * 4 + lVar23);
          auVar223 = *(undefined1 (*) [32])(lVar23 + 0x21b13cc + lVar98 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar23 + 0x21b1850 + lVar98 * 4);
          pfVar3 = (float *)(lVar23 + 0x21b1cd4 + lVar98 * 4);
          fVar82 = *pfVar3;
          fVar83 = pfVar3[1];
          fVar84 = pfVar3[2];
          fVar85 = pfVar3[3];
          fVar86 = pfVar3[4];
          fVar87 = pfVar3[5];
          fVar88 = pfVar3[6];
          auVar79._4_4_ = fVar83 * fStack_51c;
          auVar79._0_4_ = fVar82 * local_520;
          auVar79._8_4_ = fVar84 * fStack_518;
          auVar79._12_4_ = fVar85 * fStack_514;
          auVar79._16_4_ = fVar86 * fStack_510;
          auVar79._20_4_ = fVar87 * fStack_50c;
          auVar79._24_4_ = fVar88 * fStack_508;
          auVar79._28_4_ = fStack_504;
          auVar46._4_4_ = local_280._4_4_ * fVar83;
          auVar46._0_4_ = (float)local_280 * fVar82;
          auVar46._8_4_ = (float)uStack_278 * fVar84;
          auVar46._12_4_ = uStack_278._4_4_ * fVar85;
          auVar46._16_4_ = (float)uStack_270 * fVar86;
          auVar46._20_4_ = uStack_270._4_4_ * fVar87;
          auVar46._24_4_ = (float)uStack_268 * fVar88;
          auVar46._28_4_ = auVar109._28_4_;
          auVar105 = vfmadd231ps_fma(auVar79,auVar7,auVar141._0_32_);
          auVar104 = vfmadd231ps_fma(auVar46,auVar7,auVar164._0_32_);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar223,auVar178);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar223,local_560);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar132,auVar229);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar132,local_540);
          local_440 = ZEXT1632(auVar105);
          local_6e0 = ZEXT1632(auVar170);
          auVar110 = vsubps_avx(local_440,local_6e0);
          local_460 = ZEXT1632(auVar175);
          local_620 = ZEXT1632(auVar104);
          auVar21 = vsubps_avx(local_620,local_460);
          auVar225 = ZEXT3264(auVar21);
          auVar77._4_4_ = auVar175._4_4_ * auVar110._4_4_;
          auVar77._0_4_ = auVar175._0_4_ * auVar110._0_4_;
          auVar77._8_4_ = auVar175._8_4_ * auVar110._8_4_;
          auVar77._12_4_ = auVar175._12_4_ * auVar110._12_4_;
          auVar77._16_4_ = auVar110._16_4_ * 0.0;
          auVar77._20_4_ = auVar110._20_4_ * 0.0;
          auVar77._24_4_ = auVar110._24_4_ * 0.0;
          auVar77._28_4_ = local_560._28_4_;
          fVar210 = auVar21._0_4_;
          auVar164._0_4_ = auVar170._0_4_ * fVar210;
          fVar216 = auVar21._4_4_;
          auVar164._4_4_ = auVar170._4_4_ * fVar216;
          fVar217 = auVar21._8_4_;
          auVar164._8_4_ = auVar170._8_4_ * fVar217;
          fVar218 = auVar21._12_4_;
          auVar164._12_4_ = auVar170._12_4_ * fVar218;
          fVar219 = auVar21._16_4_;
          auVar164._16_4_ = fVar219 * 0.0;
          fVar220 = auVar21._20_4_;
          auVar164._20_4_ = fVar220 * 0.0;
          fVar221 = auVar21._24_4_;
          auVar164._28_36_ = auVar141._28_36_;
          auVar164._24_4_ = fVar221 * 0.0;
          auVar156 = vsubps_avx(auVar77,auVar164._0_32_);
          auVar47._4_4_ = local_e0._4_4_ * fVar80;
          auVar47._0_4_ = (float)local_e0 * fVar123;
          auVar47._8_4_ = (float)uStack_d8 * fVar81;
          auVar47._12_4_ = uStack_d8._4_4_ * fVar124;
          auVar47._16_4_ = (float)uStack_d0 * fVar142;
          auVar47._20_4_ = uStack_d0._4_4_ * fVar182;
          auVar47._24_4_ = (float)uStack_c8 * fVar190;
          auVar47._28_4_ = local_560._28_4_;
          auVar170 = vfmadd231ps_fma(auVar47,auVar116,local_c0);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),local_a0,auVar117);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),local_80,auVar109);
          auVar48._4_4_ = fVar83 * local_e0._4_4_;
          auVar48._0_4_ = fVar82 * (float)local_e0;
          auVar48._8_4_ = fVar84 * (float)uStack_d8;
          auVar48._12_4_ = fVar85 * uStack_d8._4_4_;
          auVar48._16_4_ = fVar86 * (float)uStack_d0;
          auVar48._20_4_ = fVar87 * uStack_d0._4_4_;
          auVar48._24_4_ = fVar88 * (float)uStack_c8;
          auVar48._28_4_ = uStack_c8._4_4_;
          auVar175 = vfmadd231ps_fma(auVar48,auVar7,local_c0);
          auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar223,local_a0);
          auVar175 = vfmadd231ps_fma(ZEXT1632(auVar175),auVar132,local_80);
          auVar49._4_4_ = fVar216 * fVar216;
          auVar49._0_4_ = fVar210 * fVar210;
          auVar49._8_4_ = fVar217 * fVar217;
          auVar49._12_4_ = fVar218 * fVar218;
          auVar49._16_4_ = fVar219 * fVar219;
          auVar49._20_4_ = fVar220 * fVar220;
          auVar49._24_4_ = fVar221 * fVar221;
          auVar49._28_4_ = uStack_268._4_4_;
          auVar105 = vfmadd231ps_fma(auVar49,auVar110,auVar110);
          local_580 = ZEXT1632(auVar170);
          auVar199 = vmaxps_avx(local_580,ZEXT1632(auVar175));
          fVar210 = auVar199._0_4_ * auVar199._0_4_;
          fVar216 = auVar199._4_4_ * auVar199._4_4_;
          fVar217 = auVar199._8_4_ * auVar199._8_4_;
          fVar218 = auVar199._12_4_ * auVar199._12_4_;
          fVar219 = auVar199._16_4_ * auVar199._16_4_;
          fVar220 = auVar199._20_4_ * auVar199._20_4_;
          fVar221 = auVar199._24_4_ * auVar199._24_4_;
          auVar214 = ZEXT3264(CONCAT428(auVar199._28_4_,
                                        CONCAT424(fVar221,CONCAT420(fVar220,CONCAT416(fVar219,
                                                  CONCAT412(fVar218,CONCAT48(fVar217,CONCAT44(
                                                  fVar216,fVar210))))))));
          auVar204._0_4_ = fVar210 * auVar105._0_4_;
          auVar204._4_4_ = fVar216 * auVar105._4_4_;
          auVar204._8_4_ = fVar217 * auVar105._8_4_;
          auVar204._12_4_ = fVar218 * auVar105._12_4_;
          auVar204._16_4_ = fVar219 * 0.0;
          auVar204._20_4_ = fVar220 * 0.0;
          auVar204._24_4_ = fVar221 * 0.0;
          auVar204._28_4_ = 0;
          auVar50._4_4_ = auVar156._4_4_ * auVar156._4_4_;
          auVar50._0_4_ = auVar156._0_4_ * auVar156._0_4_;
          auVar50._8_4_ = auVar156._8_4_ * auVar156._8_4_;
          auVar50._12_4_ = auVar156._12_4_ * auVar156._12_4_;
          auVar50._16_4_ = auVar156._16_4_ * auVar156._16_4_;
          auVar50._20_4_ = auVar156._20_4_ * auVar156._20_4_;
          auVar50._24_4_ = auVar156._24_4_ * auVar156._24_4_;
          auVar50._28_4_ = auVar156._28_4_;
          auVar199 = vcmpps_avx(auVar50,auVar204,2);
          local_3a0 = (int)lVar98;
          auVar205._4_4_ = local_3a0;
          auVar205._0_4_ = local_3a0;
          auVar205._8_4_ = local_3a0;
          auVar205._12_4_ = local_3a0;
          auVar205._16_4_ = local_3a0;
          auVar205._20_4_ = local_3a0;
          auVar205._24_4_ = local_3a0;
          auVar205._28_4_ = local_3a0;
          auVar156 = vpor_avx2(auVar205,_DAT_01fe9900);
          auVar22 = vpcmpgtd_avx2(local_480,auVar156);
          auVar156 = auVar22 & auVar199;
          if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar156 >> 0x7f,0) == '\0') &&
                (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar156 >> 0xbf,0) == '\0') &&
              (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar156[0x1f]) {
            auVar141 = ZEXT3264(local_720);
          }
          else {
            local_4a0 = vandps_avx(auVar22,auVar199);
            auVar51._4_4_ = (float)local_700._4_4_ * fVar83;
            auVar51._0_4_ = (float)local_700._0_4_ * fVar82;
            auVar51._8_4_ = fStack_6f8 * fVar84;
            auVar51._12_4_ = fStack_6f4 * fVar85;
            auVar51._16_4_ = fStack_6f0 * fVar86;
            auVar51._20_4_ = fStack_6ec * fVar87;
            auVar51._24_4_ = fStack_6e8 * fVar88;
            auVar51._28_4_ = auVar199._28_4_;
            auVar170 = vfmadd213ps_fma(auVar7,local_760,auVar51);
            auVar170 = vfmadd213ps_fma(auVar223,local_740,ZEXT1632(auVar170));
            auVar170 = vfmadd213ps_fma(auVar132,local_7a0,ZEXT1632(auVar170));
            local_5c0._0_4_ = auVar92._0_4_;
            local_5c0._4_4_ = auVar92._4_4_;
            fStack_5b8 = auVar92._8_4_;
            fStack_5b4 = auVar92._12_4_;
            fStack_5b0 = auVar92._16_4_;
            fStack_5ac = auVar92._20_4_;
            fStack_5a8 = auVar92._24_4_;
            auVar52._4_4_ = (float)local_700._4_4_ * (float)local_5c0._4_4_;
            auVar52._0_4_ = (float)local_700._0_4_ * (float)local_5c0._0_4_;
            auVar52._8_4_ = fStack_6f8 * fStack_5b8;
            auVar52._12_4_ = fStack_6f4 * fStack_5b4;
            auVar52._16_4_ = fStack_6f0 * fStack_5b0;
            auVar52._20_4_ = fStack_6ec * fStack_5ac;
            auVar52._24_4_ = fStack_6e8 * fStack_5a8;
            auVar52._28_4_ = auVar199._28_4_;
            auVar105 = vfmadd213ps_fma(auVar116,local_760,auVar52);
            auVar105 = vfmadd213ps_fma(auVar117,local_740,ZEXT1632(auVar105));
            auVar117 = *(undefined1 (*) [32])(lVar23 + 0x21afd38 + lVar98 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar23 + 0x21b01bc + lVar98 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar23 + 0x21b0640 + lVar98 * 4);
            pfVar3 = (float *)(lVar23 + 0x21b0ac4 + lVar98 * 4);
            fVar210 = *pfVar3;
            fVar216 = pfVar3[1];
            fVar217 = pfVar3[2];
            fVar218 = pfVar3[3];
            fVar219 = pfVar3[4];
            fVar220 = pfVar3[5];
            fVar221 = pfVar3[6];
            auVar53._4_4_ = fVar216 * fStack_51c;
            auVar53._0_4_ = fVar210 * local_520;
            auVar53._8_4_ = fVar217 * fStack_518;
            auVar53._12_4_ = fVar218 * fStack_514;
            auVar53._16_4_ = fVar219 * fStack_510;
            auVar53._20_4_ = fVar220 * fStack_50c;
            auVar53._24_4_ = fVar221 * fStack_508;
            auVar53._28_4_ = local_760._28_4_;
            auVar54._4_4_ = local_280._4_4_ * fVar216;
            auVar54._0_4_ = (float)local_280 * fVar210;
            auVar54._8_4_ = (float)uStack_278 * fVar217;
            auVar54._12_4_ = uStack_278._4_4_ * fVar218;
            auVar54._16_4_ = (float)uStack_270 * fVar219;
            auVar54._20_4_ = uStack_270._4_4_ * fVar220;
            auVar54._24_4_ = (float)uStack_268 * fVar221;
            auVar54._28_4_ = auVar21._28_4_;
            auVar55._4_4_ = (float)local_700._4_4_ * fVar216;
            auVar55._0_4_ = (float)local_700._0_4_ * fVar210;
            auVar55._8_4_ = fStack_6f8 * fVar217;
            auVar55._12_4_ = fStack_6f4 * fVar218;
            auVar55._16_4_ = fStack_6f0 * fVar219;
            auVar55._20_4_ = fStack_6ec * fVar220;
            auVar55._24_4_ = fStack_6e8 * fVar221;
            auVar55._28_4_ = pfVar3[7];
            auVar104 = vfmadd231ps_fma(auVar53,auVar132,local_720);
            auVar143 = vfmadd231ps_fma(auVar54,auVar132,local_6c0);
            auVar126 = vfmadd231ps_fma(auVar55,local_760,auVar132);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar116,auVar178);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar116,local_560);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_740,auVar116);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar117,auVar229);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar117,local_540);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_7a0,auVar117);
            pfVar3 = (float *)(lVar23 + 0x21b2ee4 + lVar98 * 4);
            fVar210 = *pfVar3;
            fVar216 = pfVar3[1];
            fVar217 = pfVar3[2];
            fVar218 = pfVar3[3];
            fVar219 = pfVar3[4];
            fVar220 = pfVar3[5];
            fVar221 = pfVar3[6];
            auVar56._4_4_ = fStack_51c * fVar216;
            auVar56._0_4_ = local_520 * fVar210;
            auVar56._8_4_ = fStack_518 * fVar217;
            auVar56._12_4_ = fStack_514 * fVar218;
            auVar56._16_4_ = fStack_510 * fVar219;
            auVar56._20_4_ = fStack_50c * fVar220;
            auVar56._24_4_ = fStack_508 * fVar221;
            auVar56._28_4_ = uStack_6e4;
            auVar57._4_4_ = local_280._4_4_ * fVar216;
            auVar57._0_4_ = (float)local_280 * fVar210;
            auVar57._8_4_ = (float)uStack_278 * fVar217;
            auVar57._12_4_ = uStack_278._4_4_ * fVar218;
            auVar57._16_4_ = (float)uStack_270 * fVar219;
            auVar57._20_4_ = uStack_270._4_4_ * fVar220;
            auVar57._24_4_ = (float)uStack_268 * fVar221;
            auVar57._28_4_ = local_7a0._28_4_;
            auVar58._4_4_ = fVar216 * (float)local_700._4_4_;
            auVar58._0_4_ = fVar210 * (float)local_700._0_4_;
            auVar58._8_4_ = fVar217 * fStack_6f8;
            auVar58._12_4_ = fVar218 * fStack_6f4;
            auVar58._16_4_ = fVar219 * fStack_6f0;
            auVar58._20_4_ = fVar220 * fStack_6ec;
            auVar58._24_4_ = fVar221 * fStack_6e8;
            auVar58._28_4_ = pfVar3[7];
            auVar117 = *(undefined1 (*) [32])(lVar23 + 0x21b2a60 + lVar98 * 4);
            auVar103 = vfmadd231ps_fma(auVar56,auVar117,local_720);
            auVar127 = vfmadd231ps_fma(auVar57,auVar117,local_6c0);
            auVar160 = vfmadd231ps_fma(auVar58,auVar117,local_760);
            auVar117 = *(undefined1 (*) [32])(lVar23 + 0x21b25dc + lVar98 * 4);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar117,auVar178);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar117,local_560);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar117,local_740);
            auVar117 = *(undefined1 (*) [32])(lVar23 + 0x21b2158 + lVar98 * 4);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar117,auVar229);
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar117,local_540);
            auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),local_7a0,auVar117);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar206._16_4_ = 0x7fffffff;
            auVar206._20_4_ = 0x7fffffff;
            auVar206._24_4_ = 0x7fffffff;
            auVar206._28_4_ = 0x7fffffff;
            auVar117 = vandps_avx(ZEXT1632(auVar104),auVar206);
            auVar116 = vandps_avx(ZEXT1632(auVar143),auVar206);
            auVar116 = vmaxps_avx(auVar117,auVar116);
            auVar117 = vandps_avx(ZEXT1632(auVar126),auVar206);
            auVar117 = vmaxps_avx(auVar116,auVar117);
            auVar117 = vcmpps_avx(auVar117,_local_4c0,1);
            auVar132 = vblendvps_avx(ZEXT1632(auVar104),auVar110,auVar117);
            auVar223 = vblendvps_avx(ZEXT1632(auVar143),auVar21,auVar117);
            auVar117 = vandps_avx(ZEXT1632(auVar103),auVar206);
            auVar116 = vandps_avx(ZEXT1632(auVar127),auVar206);
            auVar116 = vmaxps_avx(auVar117,auVar116);
            auVar117 = vandps_avx(auVar206,ZEXT1632(auVar160));
            auVar117 = vmaxps_avx(auVar116,auVar117);
            auVar116 = vcmpps_avx(auVar117,_local_4c0,1);
            auVar117 = vblendvps_avx(ZEXT1632(auVar103),auVar110,auVar116);
            auVar116 = vblendvps_avx(ZEXT1632(auVar127),auVar21,auVar116);
            auVar105 = vfmadd213ps_fma(auVar109,local_7a0,ZEXT1632(auVar105));
            auVar104 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar223,auVar223);
            auVar109 = vrsqrtps_avx(ZEXT1632(auVar104));
            fVar210 = auVar109._0_4_;
            fVar216 = auVar109._4_4_;
            fVar217 = auVar109._8_4_;
            fVar218 = auVar109._12_4_;
            fVar219 = auVar109._16_4_;
            fVar220 = auVar109._20_4_;
            fVar221 = auVar109._24_4_;
            auVar59._4_4_ = fVar216 * fVar216 * fVar216 * auVar104._4_4_ * -0.5;
            auVar59._0_4_ = fVar210 * fVar210 * fVar210 * auVar104._0_4_ * -0.5;
            auVar59._8_4_ = fVar217 * fVar217 * fVar217 * auVar104._8_4_ * -0.5;
            auVar59._12_4_ = fVar218 * fVar218 * fVar218 * auVar104._12_4_ * -0.5;
            auVar59._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
            auVar59._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
            auVar59._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
            auVar59._28_4_ = 0;
            auVar231._8_4_ = 0x3fc00000;
            auVar231._0_8_ = 0x3fc000003fc00000;
            auVar231._12_4_ = 0x3fc00000;
            auVar231._16_4_ = 0x3fc00000;
            auVar231._20_4_ = 0x3fc00000;
            auVar231._24_4_ = 0x3fc00000;
            auVar231._28_4_ = 0x3fc00000;
            auVar104 = vfmadd231ps_fma(auVar59,auVar231,auVar109);
            fVar210 = auVar104._0_4_;
            fVar216 = auVar104._4_4_;
            auVar60._4_4_ = auVar223._4_4_ * fVar216;
            auVar60._0_4_ = auVar223._0_4_ * fVar210;
            fVar217 = auVar104._8_4_;
            auVar60._8_4_ = auVar223._8_4_ * fVar217;
            fVar218 = auVar104._12_4_;
            auVar60._12_4_ = auVar223._12_4_ * fVar218;
            auVar60._16_4_ = auVar223._16_4_ * 0.0;
            auVar60._20_4_ = auVar223._20_4_ * 0.0;
            auVar60._24_4_ = auVar223._24_4_ * 0.0;
            auVar60._28_4_ = auVar109._28_4_;
            auVar61._4_4_ = fVar216 * -auVar132._4_4_;
            auVar61._0_4_ = fVar210 * -auVar132._0_4_;
            auVar61._8_4_ = fVar217 * -auVar132._8_4_;
            auVar61._12_4_ = fVar218 * -auVar132._12_4_;
            auVar61._16_4_ = -auVar132._16_4_ * 0.0;
            auVar61._20_4_ = -auVar132._20_4_ * 0.0;
            auVar61._24_4_ = -auVar132._24_4_ * 0.0;
            auVar61._28_4_ = auVar223._28_4_;
            auVar104 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar116,auVar116);
            auVar109 = vrsqrtps_avx(ZEXT1632(auVar104));
            auVar62._28_4_ = fStack_504;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar218 * 0.0,
                                    CONCAT48(fVar217 * 0.0,CONCAT44(fVar216 * 0.0,fVar210 * 0.0))));
            fVar210 = auVar109._0_4_;
            fVar216 = auVar109._4_4_;
            fVar217 = auVar109._8_4_;
            fVar218 = auVar109._12_4_;
            fVar219 = auVar109._16_4_;
            fVar220 = auVar109._20_4_;
            fVar221 = auVar109._24_4_;
            auVar63._4_4_ = fVar216 * fVar216 * fVar216 * auVar104._4_4_ * -0.5;
            auVar63._0_4_ = fVar210 * fVar210 * fVar210 * auVar104._0_4_ * -0.5;
            auVar63._8_4_ = fVar217 * fVar217 * fVar217 * auVar104._8_4_ * -0.5;
            auVar63._12_4_ = fVar218 * fVar218 * fVar218 * auVar104._12_4_ * -0.5;
            auVar63._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
            auVar63._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
            auVar63._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
            auVar63._28_4_ = 0;
            auVar104 = vfmadd231ps_fma(auVar63,auVar231,auVar109);
            fVar210 = auVar104._0_4_;
            auVar226._0_4_ = auVar116._0_4_ * fVar210;
            fVar216 = auVar104._4_4_;
            auVar226._4_4_ = auVar116._4_4_ * fVar216;
            fVar217 = auVar104._8_4_;
            auVar226._8_4_ = auVar116._8_4_ * fVar217;
            fVar218 = auVar104._12_4_;
            auVar226._12_4_ = auVar116._12_4_ * fVar218;
            auVar226._16_4_ = auVar116._16_4_ * 0.0;
            auVar226._20_4_ = auVar116._20_4_ * 0.0;
            auVar226._24_4_ = auVar116._24_4_ * 0.0;
            auVar226._28_4_ = 0;
            auVar64._4_4_ = fVar216 * -auVar117._4_4_;
            auVar64._0_4_ = fVar210 * -auVar117._0_4_;
            auVar64._8_4_ = fVar217 * -auVar117._8_4_;
            auVar64._12_4_ = fVar218 * -auVar117._12_4_;
            auVar64._16_4_ = -auVar117._16_4_ * 0.0;
            auVar64._20_4_ = -auVar117._20_4_ * 0.0;
            auVar64._24_4_ = -auVar117._24_4_ * 0.0;
            auVar64._28_4_ = auVar109._28_4_;
            auVar65._28_4_ = 0xbf000000;
            auVar65._0_28_ =
                 ZEXT1628(CONCAT412(fVar218 * 0.0,
                                    CONCAT48(fVar217 * 0.0,CONCAT44(fVar216 * 0.0,fVar210 * 0.0))));
            auVar104 = vfmadd213ps_fma(auVar60,local_580,local_6e0);
            auVar143 = vfmadd213ps_fma(auVar61,local_580,local_460);
            auVar126 = vfmadd213ps_fma(auVar62,local_580,ZEXT1632(auVar105));
            auVar166 = vfnmadd213ps_fma(auVar60,local_580,local_6e0);
            auVar103 = vfmadd213ps_fma(auVar226,ZEXT1632(auVar175),local_440);
            auVar102 = vfnmadd213ps_fma(auVar61,local_580,local_460);
            auVar109 = ZEXT1632(auVar175);
            auVar127 = vfmadd213ps_fma(auVar64,auVar109,local_620);
            auVar183 = vfnmadd231ps_fma(ZEXT1632(auVar105),local_580,auVar62);
            auVar105 = vfmadd213ps_fma(auVar65,auVar109,ZEXT1632(auVar170));
            auVar125 = vfnmadd213ps_fma(auVar226,auVar109,local_440);
            auVar165 = vfnmadd213ps_fma(auVar64,auVar109,local_620);
            auVar184 = vfnmadd231ps_fma(ZEXT1632(auVar170),ZEXT1632(auVar175),auVar65);
            auVar109 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar102));
            auVar117 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar183));
            auVar66._4_4_ = auVar109._4_4_ * auVar183._4_4_;
            auVar66._0_4_ = auVar109._0_4_ * auVar183._0_4_;
            auVar66._8_4_ = auVar109._8_4_ * auVar183._8_4_;
            auVar66._12_4_ = auVar109._12_4_ * auVar183._12_4_;
            auVar66._16_4_ = auVar109._16_4_ * 0.0;
            auVar66._20_4_ = auVar109._20_4_ * 0.0;
            auVar66._24_4_ = auVar109._24_4_ * 0.0;
            auVar66._28_4_ = fStack_504;
            auVar160 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar102),auVar117);
            auVar67._4_4_ = auVar166._4_4_ * auVar117._4_4_;
            auVar67._0_4_ = auVar166._0_4_ * auVar117._0_4_;
            auVar67._8_4_ = auVar166._8_4_ * auVar117._8_4_;
            auVar67._12_4_ = auVar166._12_4_ * auVar117._12_4_;
            auVar67._16_4_ = auVar117._16_4_ * 0.0;
            auVar67._20_4_ = auVar117._20_4_ * 0.0;
            auVar67._24_4_ = auVar117._24_4_ * 0.0;
            auVar67._28_4_ = auVar117._28_4_;
            auVar199 = ZEXT1632(auVar166);
            auVar117 = vsubps_avx(ZEXT1632(auVar103),auVar199);
            auVar156 = ZEXT1632(auVar183);
            auVar170 = vfmsub231ps_fma(auVar67,auVar156,auVar117);
            auVar68._4_4_ = auVar102._4_4_ * auVar117._4_4_;
            auVar68._0_4_ = auVar102._0_4_ * auVar117._0_4_;
            auVar68._8_4_ = auVar102._8_4_ * auVar117._8_4_;
            auVar68._12_4_ = auVar102._12_4_ * auVar117._12_4_;
            auVar68._16_4_ = auVar117._16_4_ * 0.0;
            auVar68._20_4_ = auVar117._20_4_ * 0.0;
            auVar68._24_4_ = auVar117._24_4_ * 0.0;
            auVar68._28_4_ = auVar117._28_4_;
            auVar166 = vfmsub231ps_fma(auVar68,auVar199,auVar109);
            auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar170 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar109,ZEXT1632(auVar170));
            auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar109,ZEXT1632(auVar160));
            auVar22 = vcmpps_avx(ZEXT1632(auVar170),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar109 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar104),auVar22);
            auVar117 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar143),auVar22);
            auVar116 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar126),auVar22);
            auVar225 = ZEXT3264(auVar116);
            auVar132 = vblendvps_avx(auVar199,ZEXT1632(auVar103),auVar22);
            auVar223 = vblendvps_avx(ZEXT1632(auVar102),ZEXT1632(auVar127),auVar22);
            auVar7 = vblendvps_avx(auVar156,ZEXT1632(auVar105),auVar22);
            auVar199 = vblendvps_avx(ZEXT1632(auVar103),auVar199,auVar22);
            auVar110 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar102),auVar22);
            auVar170 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
            auVar156 = vblendvps_avx(ZEXT1632(auVar105),auVar156,auVar22);
            auVar199 = vsubps_avx(auVar199,auVar109);
            auVar110 = vsubps_avx(auVar110,auVar117);
            auVar20 = vsubps_avx(auVar156,auVar116);
            auVar111 = vsubps_avx(auVar109,auVar132);
            auVar128 = vsubps_avx(auVar117,auVar223);
            auVar214 = ZEXT3264(auVar128);
            auVar161 = vsubps_avx(auVar116,auVar7);
            auVar187._0_4_ = auVar20._0_4_ * auVar109._0_4_;
            auVar187._4_4_ = auVar20._4_4_ * auVar109._4_4_;
            auVar187._8_4_ = auVar20._8_4_ * auVar109._8_4_;
            auVar187._12_4_ = auVar20._12_4_ * auVar109._12_4_;
            auVar187._16_4_ = auVar20._16_4_ * auVar109._16_4_;
            auVar187._20_4_ = auVar20._20_4_ * auVar109._20_4_;
            auVar187._24_4_ = auVar20._24_4_ * auVar109._24_4_;
            auVar187._28_4_ = 0;
            auVar105 = vfmsub231ps_fma(auVar187,auVar116,auVar199);
            auVar69._4_4_ = auVar199._4_4_ * auVar117._4_4_;
            auVar69._0_4_ = auVar199._0_4_ * auVar117._0_4_;
            auVar69._8_4_ = auVar199._8_4_ * auVar117._8_4_;
            auVar69._12_4_ = auVar199._12_4_ * auVar117._12_4_;
            auVar69._16_4_ = auVar199._16_4_ * auVar117._16_4_;
            auVar69._20_4_ = auVar199._20_4_ * auVar117._20_4_;
            auVar69._24_4_ = auVar199._24_4_ * auVar117._24_4_;
            auVar69._28_4_ = auVar156._28_4_;
            auVar104 = vfmsub231ps_fma(auVar69,auVar109,auVar110);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
            auVar188._0_4_ = auVar116._0_4_ * auVar110._0_4_;
            auVar188._4_4_ = auVar116._4_4_ * auVar110._4_4_;
            auVar188._8_4_ = auVar116._8_4_ * auVar110._8_4_;
            auVar188._12_4_ = auVar116._12_4_ * auVar110._12_4_;
            auVar188._16_4_ = auVar116._16_4_ * auVar110._16_4_;
            auVar188._20_4_ = auVar116._20_4_ * auVar110._20_4_;
            auVar188._24_4_ = auVar116._24_4_ * auVar110._24_4_;
            auVar188._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar188,auVar117,auVar20);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar104));
            auVar189._0_4_ = auVar161._0_4_ * auVar132._0_4_;
            auVar189._4_4_ = auVar161._4_4_ * auVar132._4_4_;
            auVar189._8_4_ = auVar161._8_4_ * auVar132._8_4_;
            auVar189._12_4_ = auVar161._12_4_ * auVar132._12_4_;
            auVar189._16_4_ = auVar161._16_4_ * auVar132._16_4_;
            auVar189._20_4_ = auVar161._20_4_ * auVar132._20_4_;
            auVar189._24_4_ = auVar161._24_4_ * auVar132._24_4_;
            auVar189._28_4_ = 0;
            auVar105 = vfmsub231ps_fma(auVar189,auVar111,auVar7);
            auVar70._4_4_ = auVar128._4_4_ * auVar7._4_4_;
            auVar70._0_4_ = auVar128._0_4_ * auVar7._0_4_;
            auVar70._8_4_ = auVar128._8_4_ * auVar7._8_4_;
            auVar70._12_4_ = auVar128._12_4_ * auVar7._12_4_;
            auVar70._16_4_ = auVar128._16_4_ * auVar7._16_4_;
            auVar70._20_4_ = auVar128._20_4_ * auVar7._20_4_;
            auVar70._24_4_ = auVar128._24_4_ * auVar7._24_4_;
            auVar70._28_4_ = auVar7._28_4_;
            auVar143 = vfmsub231ps_fma(auVar70,auVar223,auVar161);
            auVar71._4_4_ = auVar111._4_4_ * auVar223._4_4_;
            auVar71._0_4_ = auVar111._0_4_ * auVar223._0_4_;
            auVar71._8_4_ = auVar111._8_4_ * auVar223._8_4_;
            auVar71._12_4_ = auVar111._12_4_ * auVar223._12_4_;
            auVar71._16_4_ = auVar111._16_4_ * auVar223._16_4_;
            auVar71._20_4_ = auVar111._20_4_ * auVar223._20_4_;
            auVar71._24_4_ = auVar111._24_4_ * auVar223._24_4_;
            auVar71._28_4_ = auVar223._28_4_;
            auVar126 = vfmsub231ps_fma(auVar71,auVar128,auVar132);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT832(0) << 0x20,ZEXT1632(auVar105));
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
            auVar132 = vmaxps_avx(ZEXT1632(auVar104),ZEXT1632(auVar143));
            auVar132 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,2);
            auVar105 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
            auVar170 = vpand_avx(auVar105,auVar170);
            auVar132 = vpmovsxwd_avx2(auVar170);
            if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0x7f,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0xbf,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar132[0x1f]) {
LAB_015ca1d9:
              auVar163._8_8_ = local_680[1]._8_8_;
              auVar163._0_8_ = local_680[1]._0_8_;
              auVar163._16_8_ = local_680[1]._16_8_;
              auVar163._24_8_ = local_680[1]._24_8_;
            }
            else {
              auVar72._4_4_ = auVar161._4_4_ * auVar110._4_4_;
              auVar72._0_4_ = auVar161._0_4_ * auVar110._0_4_;
              auVar72._8_4_ = auVar161._8_4_ * auVar110._8_4_;
              auVar72._12_4_ = auVar161._12_4_ * auVar110._12_4_;
              auVar72._16_4_ = auVar161._16_4_ * auVar110._16_4_;
              auVar72._20_4_ = auVar161._20_4_ * auVar110._20_4_;
              auVar72._24_4_ = auVar161._24_4_ * auVar110._24_4_;
              auVar72._28_4_ = auVar132._28_4_;
              auVar127 = vfmsub231ps_fma(auVar72,auVar128,auVar20);
              auVar193._0_4_ = auVar20._0_4_ * auVar111._0_4_;
              auVar193._4_4_ = auVar20._4_4_ * auVar111._4_4_;
              auVar193._8_4_ = auVar20._8_4_ * auVar111._8_4_;
              auVar193._12_4_ = auVar20._12_4_ * auVar111._12_4_;
              auVar193._16_4_ = auVar20._16_4_ * auVar111._16_4_;
              auVar193._20_4_ = auVar20._20_4_ * auVar111._20_4_;
              auVar193._24_4_ = auVar20._24_4_ * auVar111._24_4_;
              auVar193._28_4_ = 0;
              auVar103 = vfmsub231ps_fma(auVar193,auVar199,auVar161);
              auVar73._4_4_ = auVar199._4_4_ * auVar128._4_4_;
              auVar73._0_4_ = auVar199._0_4_ * auVar128._0_4_;
              auVar73._8_4_ = auVar199._8_4_ * auVar128._8_4_;
              auVar73._12_4_ = auVar199._12_4_ * auVar128._12_4_;
              auVar73._16_4_ = auVar199._16_4_ * auVar128._16_4_;
              auVar73._20_4_ = auVar199._20_4_ * auVar128._20_4_;
              auVar73._24_4_ = auVar199._24_4_ * auVar128._24_4_;
              auVar73._28_4_ = auVar128._28_4_;
              auVar160 = vfmsub231ps_fma(auVar73,auVar111,auVar110);
              auVar214 = ZEXT1664(auVar160);
              auVar105 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar160));
              auVar126 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar127),ZEXT832(0) << 0x20);
              auVar132 = vrcpps_avx(ZEXT1632(auVar126));
              auVar224._8_4_ = 0x3f800000;
              auVar224._0_8_ = 0x3f8000003f800000;
              auVar224._12_4_ = 0x3f800000;
              auVar224._16_4_ = 0x3f800000;
              auVar224._20_4_ = 0x3f800000;
              auVar224._24_4_ = 0x3f800000;
              auVar224._28_4_ = 0x3f800000;
              auVar225 = ZEXT3264(auVar224);
              auVar105 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar126),auVar224);
              auVar105 = vfmadd132ps_fma(ZEXT1632(auVar105),auVar132,auVar132);
              auVar74._4_4_ = auVar160._4_4_ * auVar116._4_4_;
              auVar74._0_4_ = auVar160._0_4_ * auVar116._0_4_;
              auVar74._8_4_ = auVar160._8_4_ * auVar116._8_4_;
              auVar74._12_4_ = auVar160._12_4_ * auVar116._12_4_;
              auVar74._16_4_ = auVar116._16_4_ * 0.0;
              auVar74._20_4_ = auVar116._20_4_ * 0.0;
              auVar74._24_4_ = auVar116._24_4_ * 0.0;
              auVar74._28_4_ = auVar110._28_4_;
              auVar103 = vfmadd231ps_fma(auVar74,auVar117,ZEXT1632(auVar103));
              auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT1632(auVar127),auVar109);
              fVar210 = auVar105._0_4_;
              fVar216 = auVar105._4_4_;
              fVar217 = auVar105._8_4_;
              fVar218 = auVar105._12_4_;
              auVar116 = ZEXT1632(CONCAT412(fVar218 * auVar103._12_4_,
                                            CONCAT48(fVar217 * auVar103._8_4_,
                                                     CONCAT44(fVar216 * auVar103._4_4_,
                                                              fVar210 * auVar103._0_4_))));
              uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar162._4_4_ = uVar100;
              auVar162._0_4_ = uVar100;
              auVar162._8_4_ = uVar100;
              auVar162._12_4_ = uVar100;
              auVar162._16_4_ = uVar100;
              auVar162._20_4_ = uVar100;
              auVar162._24_4_ = uVar100;
              auVar162._28_4_ = uVar100;
              auVar91._4_4_ = uStack_63c;
              auVar91._0_4_ = local_640;
              auVar91._8_4_ = uStack_638;
              auVar91._12_4_ = uStack_634;
              auVar91._16_4_ = uStack_630;
              auVar91._20_4_ = uStack_62c;
              auVar91._24_4_ = uStack_628;
              auVar91._28_4_ = uStack_624;
              auVar109 = vcmpps_avx(auVar91,auVar116,2);
              auVar117 = vcmpps_avx(auVar116,auVar162,2);
              auVar109 = vandps_avx(auVar117,auVar109);
              auVar105 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              auVar170 = vpand_avx(auVar170,auVar105);
              auVar109 = vpmovsxwd_avx2(auVar170);
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar109 >> 0x7f,0) == '\0') &&
                    (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0xbf,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar109[0x1f]) goto LAB_015ca1d9;
              auVar109 = vcmpps_avx(ZEXT1632(auVar126),ZEXT832(0) << 0x20,4);
              auVar105 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              auVar170 = vpand_avx(auVar170,auVar105);
              auVar109 = vpmovsxwd_avx2(auVar170);
              auVar163._8_8_ = local_680[1]._8_8_;
              auVar163._0_8_ = local_680[1]._0_8_;
              auVar163._16_8_ = local_680[1]._16_8_;
              auVar163._24_8_ = local_680[1]._24_8_;
              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar109 >> 0x7f,0) != '\0') ||
                    (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0xbf,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar109[0x1f] < '\0') {
                auVar132 = ZEXT1632(CONCAT412(fVar218 * auVar104._12_4_,
                                              CONCAT48(fVar217 * auVar104._8_4_,
                                                       CONCAT44(fVar216 * auVar104._4_4_,
                                                                fVar210 * auVar104._0_4_))));
                auVar75._28_4_ = SUB84(local_680[1]._24_8_,4);
                auVar75._0_28_ =
                     ZEXT1628(CONCAT412(fVar218 * auVar143._12_4_,
                                        CONCAT48(fVar217 * auVar143._8_4_,
                                                 CONCAT44(fVar216 * auVar143._4_4_,
                                                          fVar210 * auVar143._0_4_))));
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar200._16_4_ = 0x3f800000;
                auVar200._20_4_ = 0x3f800000;
                auVar200._24_4_ = 0x3f800000;
                auVar200._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx(auVar200,auVar132);
                local_100 = vblendvps_avx(auVar117,auVar132,auVar22);
                auVar117 = vsubps_avx(auVar200,auVar75);
                local_500 = vblendvps_avx(auVar117,auVar75,auVar22);
                auVar163 = auVar109;
                local_600 = auVar116;
              }
            }
            if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar163 >> 0x7f,0) == '\0') &&
                  (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar163 >> 0xbf,0) == '\0') &&
                (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar163[0x1f]) {
              auVar141 = ZEXT3264(local_720);
            }
            else {
              auVar109 = vsubps_avx(ZEXT1632(auVar175),local_580);
              auVar170 = vfmadd213ps_fma(auVar109,local_100,local_580);
              fVar210 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar76._4_4_ = (auVar170._4_4_ + auVar170._4_4_) * fVar210;
              auVar76._0_4_ = (auVar170._0_4_ + auVar170._0_4_) * fVar210;
              auVar76._8_4_ = (auVar170._8_4_ + auVar170._8_4_) * fVar210;
              auVar76._12_4_ = (auVar170._12_4_ + auVar170._12_4_) * fVar210;
              auVar76._16_4_ = fVar210 * 0.0;
              auVar76._20_4_ = fVar210 * 0.0;
              auVar76._24_4_ = fVar210 * 0.0;
              auVar76._28_4_ = fVar210;
              auVar109 = vcmpps_avx(local_600,auVar76,6);
              auVar117 = auVar163 & auVar109;
              if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar117 >> 0x7f,0) != '\0') ||
                    (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0xbf,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar117[0x1f] < '\0') {
                auVar135._8_4_ = 0xbf800000;
                auVar135._0_8_ = 0xbf800000bf800000;
                auVar135._12_4_ = 0xbf800000;
                auVar135._16_4_ = 0xbf800000;
                auVar135._20_4_ = 0xbf800000;
                auVar135._24_4_ = 0xbf800000;
                auVar135._28_4_ = 0xbf800000;
                auVar157._8_4_ = 0x40000000;
                auVar157._0_8_ = 0x4000000040000000;
                auVar157._12_4_ = 0x40000000;
                auVar157._16_4_ = 0x40000000;
                auVar157._20_4_ = 0x40000000;
                auVar157._24_4_ = 0x40000000;
                auVar157._28_4_ = 0x40000000;
                auVar170 = vfmadd213ps_fma(local_500,auVar157,auVar135);
                local_400 = local_100;
                local_3e0 = ZEXT1632(auVar170);
                local_3c0 = local_600;
                local_380 = local_850;
                uStack_378 = uStack_848;
                local_370 = local_860;
                uStack_368 = uStack_858;
                local_360 = local_870;
                uStack_358 = uStack_868;
                pGVar9 = (context->scene->geometries).items[(uint)local_8a0._4_4_].ptr;
                local_500 = local_3e0;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar109,auVar163);
                  auVar214 = ZEXT1264(ZEXT812(0));
                  fVar210 = (float)local_3a0;
                  local_320[0] = (fVar210 + local_100._0_4_ + 0.0) * local_140;
                  local_320[1] = (fVar210 + local_100._4_4_ + 1.0) * fStack_13c;
                  local_320[2] = (fVar210 + local_100._8_4_ + 2.0) * fStack_138;
                  local_320[3] = (fVar210 + local_100._12_4_ + 3.0) * fStack_134;
                  fStack_310 = (fVar210 + local_100._16_4_ + 4.0) * fStack_130;
                  fStack_30c = (fVar210 + local_100._20_4_ + 5.0) * fStack_12c;
                  fStack_308 = (fVar210 + local_100._24_4_ + 6.0) * fStack_128;
                  fStack_304 = fVar210 + local_100._28_4_ + 7.0;
                  local_500._0_8_ = auVar170._0_8_;
                  local_500._8_8_ = auVar170._8_8_;
                  local_300 = local_500._0_8_;
                  uStack_2f8 = local_500._8_8_;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  local_2e0 = local_600;
                  auVar136._8_4_ = 0x7f800000;
                  auVar136._0_8_ = 0x7f8000007f800000;
                  auVar136._12_4_ = 0x7f800000;
                  auVar136._16_4_ = 0x7f800000;
                  auVar136._20_4_ = 0x7f800000;
                  auVar136._24_4_ = 0x7f800000;
                  auVar136._28_4_ = 0x7f800000;
                  auVar109 = vblendvps_avx(auVar136,local_600,local_6a0);
                  auVar117 = vshufps_avx(auVar109,auVar109,0xb1);
                  auVar117 = vminps_avx(auVar109,auVar117);
                  auVar116 = vshufpd_avx(auVar117,auVar117,5);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  auVar116 = vpermpd_avx2(auVar117,0x4e);
                  auVar117 = vminps_avx(auVar117,auVar116);
                  auVar117 = vcmpps_avx(auVar109,auVar117,0);
                  auVar116 = local_6a0 & auVar117;
                  auVar109 = local_6a0;
                  if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar116 >> 0x7f,0) != '\0') ||
                        (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar116 >> 0xbf,0) != '\0') ||
                      (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar116[0x1f] < '\0') {
                    auVar109 = vandps_avx(auVar117,local_6a0);
                  }
                  uVar94 = vmovmskps_avx(auVar109);
                  uVar96 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar96 = uVar96 + 1;
                  }
                  uVar95 = (ulong)uVar96;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar210 = local_320[uVar95];
                    uVar100 = *(undefined4 *)((long)&local_300 + uVar95 * 4);
                    fVar216 = 1.0 - fVar210;
                    auVar170 = ZEXT416((uint)(fVar210 * fVar216 * 4.0));
                    auVar175 = vfnmsub213ss_fma(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),
                                                auVar170);
                    auVar170 = vfmadd213ss_fma(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),
                                               auVar170);
                    fVar216 = fVar216 * -fVar216 * 0.5;
                    fVar217 = auVar175._0_4_ * 0.5;
                    fVar218 = auVar170._0_4_ * 0.5;
                    fVar219 = fVar210 * fVar210 * 0.5;
                    auVar171._0_4_ = fVar219 * fVar120;
                    auVar171._4_4_ = fVar219 * fVar121;
                    auVar171._8_4_ = fVar219 * fVar122;
                    auVar171._12_4_ = fVar219 * fVar13;
                    auVar146._4_4_ = fVar218;
                    auVar146._0_4_ = fVar218;
                    auVar146._8_4_ = fVar218;
                    auVar146._12_4_ = fVar218;
                    auVar170 = vfmadd132ps_fma(auVar146,auVar171,auVar16);
                    auVar172._4_4_ = fVar217;
                    auVar172._0_4_ = fVar217;
                    auVar172._8_4_ = fVar217;
                    auVar172._12_4_ = fVar217;
                    auVar170 = vfmadd132ps_fma(auVar172,auVar170,auVar15);
                    auVar147._4_4_ = fVar216;
                    auVar147._0_4_ = fVar216;
                    auVar147._8_4_ = fVar216;
                    auVar147._12_4_ = fVar216;
                    auVar170 = vfmadd132ps_fma(auVar147,auVar170,auVar12);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar95 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar170._0_4_;
                    uVar201 = vextractps_avx(auVar170,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar201;
                    uVar201 = vextractps_avx(auVar170,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar201;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar210;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar100;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x240) = local_8a0._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
                    _local_5c0 = auVar21;
                    local_39c = iVar93;
                    local_390 = uVar89;
                    uStack_388 = uVar90;
                    while( true ) {
                      fVar210 = local_320[uVar95];
                      auVar107._4_4_ = fVar210;
                      auVar107._0_4_ = fVar210;
                      auVar107._8_4_ = fVar210;
                      auVar107._12_4_ = fVar210;
                      local_200._16_4_ = fVar210;
                      local_200._0_16_ = auVar107;
                      local_200._20_4_ = fVar210;
                      local_200._24_4_ = fVar210;
                      local_200._28_4_ = fVar210;
                      local_1e0 = *(undefined4 *)((long)&local_300 + uVar95 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar95 * 4)
                      ;
                      fVar217 = 1.0 - fVar210;
                      auVar170 = ZEXT416((uint)(fVar210 * fVar217 * 4.0));
                      auVar175 = vfnmsub213ss_fma(auVar107,auVar107,auVar170);
                      auVar170 = vfmadd213ss_fma(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),
                                                 auVar170);
                      fVar216 = auVar170._0_4_ * 0.5;
                      fVar210 = fVar210 * fVar210 * 0.5;
                      auVar173._0_4_ = fVar210 * fVar120;
                      auVar173._4_4_ = fVar210 * fVar121;
                      auVar173._8_4_ = fVar210 * fVar122;
                      auVar173._12_4_ = fVar210 * fVar13;
                      auVar148._4_4_ = fVar216;
                      auVar148._0_4_ = fVar216;
                      auVar148._8_4_ = fVar216;
                      auVar148._12_4_ = fVar216;
                      auVar170 = vfmadd132ps_fma(auVar148,auVar173,auVar16);
                      fVar210 = auVar175._0_4_ * 0.5;
                      auVar174._4_4_ = fVar210;
                      auVar174._0_4_ = fVar210;
                      auVar174._8_4_ = fVar210;
                      auVar174._12_4_ = fVar210;
                      auVar170 = vfmadd132ps_fma(auVar174,auVar170,auVar15);
                      local_7d0.context = context->user;
                      fVar210 = fVar217 * -fVar217 * 0.5;
                      auVar149._4_4_ = fVar210;
                      auVar149._0_4_ = fVar210;
                      auVar149._8_4_ = fVar210;
                      auVar149._12_4_ = fVar210;
                      auVar175 = vfmadd132ps_fma(auVar149,auVar170,auVar14);
                      local_260 = auVar175._0_4_;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      auVar170 = vmovshdup_avx(auVar175);
                      local_240 = auVar170._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      auVar170 = vshufps_avx(auVar175,auVar175,0xaa);
                      auVar150._0_8_ = auVar170._0_8_;
                      auVar150._8_8_ = auVar150._0_8_;
                      auVar158._16_8_ = auVar150._0_8_;
                      auVar158._0_16_ = auVar150;
                      auVar158._24_8_ = auVar150._0_8_;
                      local_220 = auVar158;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = CONCAT44(uStack_11c,local_120);
                      uStack_1b8 = CONCAT44(uStack_114,uStack_118);
                      uStack_1b0 = CONCAT44(uStack_10c,uStack_110);
                      uStack_1a8 = CONCAT44(uStack_104,uStack_108);
                      local_1a0._4_4_ = uStack_59c;
                      local_1a0._0_4_ = local_5a0;
                      local_1a0._8_4_ = uStack_598;
                      local_1a0._12_4_ = uStack_594;
                      local_1a0._16_4_ = uStack_590;
                      local_1a0._20_4_ = uStack_58c;
                      local_1a0._24_4_ = uStack_588;
                      local_1a0._28_4_ = uStack_584;
                      auVar109 = vpcmpeqd_avx2(local_1a0,local_1a0);
                      local_768[1] = auVar109;
                      *local_768 = auVar109;
                      local_180 = (local_7d0.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_7d0.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_680[0] = local_2c0;
                      local_7d0.valid = (int *)local_680;
                      local_7d0.geometryUserPtr = pGVar9->userPtr;
                      local_7d0.hit = (RTCHitN *)&local_260;
                      local_7d0.N = 8;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar158 = ZEXT1632(auVar150);
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*pGVar9->intersectionFilterN)(&local_7d0);
                      }
                      auVar117 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                      auVar116 = vpcmpeqd_avx2(auVar158,auVar158);
                      auVar109 = auVar116 & ~auVar117;
                      if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar109 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar109 >> 0x7f,0) == '\0') &&
                            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar109 >> 0xbf,0) == '\0') &&
                          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar109[0x1f]) {
                        auVar117 = auVar117 ^ auVar116;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar116 = ZEXT1632(auVar116._0_16_);
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          (*p_Var10)(&local_7d0);
                        }
                        auVar132 = vpcmpeqd_avx2(local_680[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar116 = vpcmpeqd_avx2(auVar116,auVar116);
                        auVar117 = auVar132 ^ auVar116;
                        auVar109 = auVar116 & ~auVar132;
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          auVar137._0_4_ = auVar132._0_4_ ^ auVar116._0_4_;
                          auVar137._4_4_ = auVar132._4_4_ ^ auVar116._4_4_;
                          auVar137._8_4_ = auVar132._8_4_ ^ auVar116._8_4_;
                          auVar137._12_4_ = auVar132._12_4_ ^ auVar116._12_4_;
                          auVar137._16_4_ = auVar132._16_4_ ^ auVar116._16_4_;
                          auVar137._20_4_ = auVar132._20_4_ ^ auVar116._20_4_;
                          auVar137._24_4_ = auVar132._24_4_ ^ auVar116._24_4_;
                          auVar137._28_4_ = auVar132._28_4_ ^ auVar116._28_4_;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])local_7d0.hit);
                          *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar109;
                          auVar109 = vmaskmovps_avx(auVar137,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar109;
                          auVar109 = vpmaskmovd_avx2(auVar137,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0x100));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar109;
                        }
                      }
                      auVar109 = local_600;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar117 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar117 >> 0x7f,0) == '\0') &&
                            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar117 >> 0xbf,0) == '\0') &&
                          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar117[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar100;
                      }
                      else {
                        uVar100 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6a0 + uVar95 * 4) = 0;
                      auVar118._4_4_ = uVar100;
                      auVar118._0_4_ = uVar100;
                      auVar118._8_4_ = uVar100;
                      auVar118._12_4_ = uVar100;
                      auVar118._16_4_ = uVar100;
                      auVar118._20_4_ = uVar100;
                      auVar118._24_4_ = uVar100;
                      auVar118._28_4_ = uVar100;
                      auVar116 = vcmpps_avx(auVar109,auVar118,2);
                      auVar117 = vandps_avx(auVar116,local_6a0);
                      local_6a0 = local_6a0 & auVar116;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar138._16_4_ = 0x7f800000;
                      auVar138._20_4_ = 0x7f800000;
                      auVar138._24_4_ = 0x7f800000;
                      auVar138._28_4_ = 0x7f800000;
                      auVar109 = vblendvps_avx(auVar138,auVar109,auVar117);
                      auVar116 = vshufps_avx(auVar109,auVar109,0xb1);
                      auVar116 = vminps_avx(auVar109,auVar116);
                      auVar132 = vshufpd_avx(auVar116,auVar116,5);
                      auVar116 = vminps_avx(auVar116,auVar132);
                      auVar132 = vpermpd_avx2(auVar116,0x4e);
                      auVar116 = vminps_avx(auVar116,auVar132);
                      auVar116 = vcmpps_avx(auVar109,auVar116,0);
                      auVar132 = auVar117 & auVar116;
                      auVar109 = auVar117;
                      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar132 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar132 >> 0x7f,0) != '\0') ||
                            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar132 >> 0xbf,0) != '\0') ||
                          (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar132[0x1f] < '\0') {
                        auVar109 = vandps_avx(auVar116,auVar117);
                      }
                      uVar94 = vmovmskps_avx(auVar109);
                      uVar96 = 0;
                      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                        uVar96 = uVar96 + 1;
                      }
                      uVar95 = (ulong)uVar96;
                      local_6a0 = auVar117;
                    }
                  }
                }
              }
              auVar141 = ZEXT3264(local_720);
            }
          }
          lVar98 = lVar98 + 8;
          auVar164 = ZEXT3264(local_6c0);
        } while ((int)lVar98 < iVar93);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar106._4_4_ = uVar4;
      auVar106._0_4_ = uVar4;
      auVar106._8_4_ = uVar4;
      auVar106._12_4_ = uVar4;
      auVar170 = vcmpps_avx(local_420,auVar106,2);
      uVar96 = vmovmskps_avx(auVar170);
      uVar96 = (uint)uVar99 & uVar96;
    } while (uVar96 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }